

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  LinearSpace3<embree::Vec3fx> *pLVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float fVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  Node *pNVar12;
  size_t sVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar16;
  size_t sVar17;
  Ref<embree::SceneGraph::Node> *pRVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  byte bVar60;
  undefined4 uVar61;
  BBox1f this_00;
  long *plVar62;
  long *plVar63;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar64;
  undefined7 uVar66;
  runtime_error *prVar65;
  byte bVar67;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  size_t *extraout_RDX_12;
  ulong uVar68;
  size_t *psVar69;
  size_t *extraout_RDX_13;
  size_t *extraout_RDX_14;
  size_t *extraout_RDX_15;
  size_t *extraout_RDX_16;
  size_t *extraout_RDX_17;
  size_t *extraout_RDX_18;
  size_t *extraout_RDX_19;
  size_t *extraout_RDX_20;
  size_t *extraout_RDX_21;
  size_t *extraout_RDX_22;
  size_t *extraout_RDX_23;
  ulong uVar70;
  ulong uVar71;
  _Base_ptr p_Var72;
  long lVar73;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  uint uVar74;
  int iVar75;
  uint uVar76;
  int iVar77;
  float fVar78;
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  Transformations c;
  float local_178;
  float local_168;
  float fStack_164;
  Transformations local_158;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  long *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_78;
  SceneGraphFlattener *local_70;
  long *local_68;
  Node *local_60;
  undefined1 local_58 [16];
  pointer local_48;
  _Base_ptr local_38;
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  
  pNVar12 = node->ptr;
  local_78 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_70 = this;
  if (pNVar12->closed == true) {
    this_00 = (BBox1f)alignedMalloc(0xa0,0x10);
    local_60 = node->ptr;
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)local_58,&local_70->node);
    SceneGraph::TransformNode::TransformNode
              ((TransformNode *)this_00,spaces,(Ref<embree::SceneGraph::Node> *)local_58);
    local_158.time_range = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_78,(Ref<embree::SceneGraph::Node> *)&local_158);
    if (local_158.time_range != (BBox1f)0x0) {
      (**(code **)(*(long *)local_158.time_range + 0x18))();
    }
    if ((Node *)local_58._0_8_ != (Node *)0x0) {
      (*((RefCount *)local_58._0_8_)->_vptr_RefCount[3])();
    }
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    if (pNVar12 == (Node *)0x0) {
      plVar62 = (long *)0x0;
    }
    else {
      plVar62 = (long *)__dynamic_cast(pNVar12,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::TransformNode::typeinfo,0);
    }
    local_110 = plVar62;
    if (plVar62 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar63 = (long *)0x0;
      }
      else {
        plVar63 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::MultiTransformNode::typeinfo,0);
      }
      local_68 = plVar63;
      if (plVar63 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar62 = (long *)0x0;
        }
        else {
          plVar62 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::GroupNode::typeinfo,0);
        }
        if (plVar62 != (long *)0x0) {
          (**(code **)(*plVar62 + 0x10))(plVar62);
          pRVar18 = (Ref<embree::SceneGraph::Node> *)plVar62[0xe];
          for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar62[0xd]; node_00 != pRVar18;
              node_00 = node_00 + 1) {
            convertInstances(local_70,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                       *)local_78,node_00,spaces);
          }
        }
        if (plVar62 != (long *)0x0) {
          (**(code **)(*plVar62 + 0x18))(plVar62);
        }
      }
      else {
        (**(code **)(*plVar63 + 0x10))(plVar63);
        local_58._0_8_ = (Node *)0x0;
        local_58._8_8_ = (pointer)0x0;
        local_48 = (pointer)0x0;
        pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)plVar63[0xd];
        if ((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)plVar63[0xe] != pAVar64) {
          p_Var72 = (_Base_ptr)0x0;
          do {
            psVar69 = &local_158.spaces.size_active;
            pLVar1 = &pAVar64->l + (long)p_Var72;
            sVar13 = *(size_t *)&(&pAVar64->l)[(long)p_Var72].vy.field_0;
            local_38 = p_Var72;
            if (sVar13 == 1) {
              uVar8 = *(undefined8 *)&(pLVar1->vx).field_0;
              fVar78 = (float)uVar8;
              fVar100 = (float)((ulong)uVar8 >> 0x20);
              fVar107 = (spaces->time_range).lower;
              fVar125 = (spaces->time_range).upper;
              uVar74 = -(uint)(fVar78 < fVar107);
              uVar76 = -(uint)(fVar100 < fVar125);
              sVar13 = (spaces->spaces).size_active;
              local_158.time_range.upper = (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76)
              ;
              local_158.time_range.lower = (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
              local_158.spaces.size_active = 0;
              local_158.spaces.size_alloced = 0;
              local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar13 != 0) {
                pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                          alignedMalloc(sVar13 << 6,0x10);
                psVar69 = extraout_RDX_12;
                local_158.spaces.size_alloced = sVar13;
                local_158.spaces.items = pAVar64;
              }
              local_158.quaternion = false;
              local_158.spaces.size_active = local_158.spaces.size_alloced;
              if ((spaces->spaces).size_active != 0) {
                lVar73 = 0x30;
                uVar70 = 0;
                do {
                  uVar74 = (uint)psVar69;
                  pauVar15 = *(undefined1 (**) [16])&(pLVar1->vz).field_0;
                  pAVar16 = (spaces->spaces).items;
                  bVar60 = *(byte *)((long)&(pLVar1->vz).field_0 + 8);
                  uVar66 = (undefined7)((ulong)pAVar64 >> 8);
                  uVar71 = CONCAT71(uVar66,bVar60);
                  bVar11 = spaces->quaternion;
                  local_158.quaternion = false;
                  fVar78 = (float)((ulong)*(undefined8 *)(*pauVar15 + 4) >> 0x20);
                  local_178 = (float)*(undefined8 *)(*pauVar15 + 4);
                  if ((((*(float *)*pauVar15 != 1.0) || (NAN(*(float *)*pauVar15))) ||
                      (local_178 != 0.0)) ||
                     (((NAN(local_178) || (fVar78 != 0.0)) || (NAN(fVar78))))) {
LAB_00162199:
                    uVar8 = *(undefined8 *)((long)pAVar16 + lVar73 + -0x30);
                    fVar107 = (float)uVar8;
                    fVar125 = (float)((ulong)uVar8 >> 0x20);
                    iVar75 = -(uint)(fVar107 != 1.0);
                    iVar77 = -(uint)(fVar125 != 0.0);
                    auVar86._4_4_ = iVar77;
                    auVar86._0_4_ = iVar75;
                    auVar86._8_4_ = iVar77;
                    auVar86._12_4_ = iVar77;
                    auVar85._8_8_ = auVar86._8_8_;
                    auVar85._4_4_ = iVar75;
                    auVar85._0_4_ = iVar75;
                    uVar74 = movmskpd(uVar74,auVar85);
                    fVar100 = *(float *)((long)pAVar16 + lVar73 + -0x28);
                    if (((uVar74 & 1) == 0) &&
                       (((bVar67 = (byte)uVar74 >> 1, bVar67 == 0 && (fVar100 == 0.0)) &&
                        (!NAN(fVar100))))) {
                      pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x24);
                      auVar51._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar51._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar51._8_4_ = -(uint)(pfVar2[2] != 1.0);
                      auVar51._12_4_ = -(uint)(pfVar2[3] != 0.0);
                      uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar51);
                      if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                         (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0)))) {
                        pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x14);
                        auVar52._4_4_ = -(uint)(pfVar2[1] != 0.0);
                        auVar52._0_4_ = -(uint)(*pfVar2 != 0.0);
                        auVar52._8_4_ = -(uint)(pfVar2[2] != 0.0);
                        auVar52._12_4_ = -(uint)(pfVar2[3] != 1.0);
                        uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar52);
                        if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                           (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0))))
                        {
                          pfVar2 = (float *)((long)pAVar16 + lVar73 + -4);
                          auVar53._4_4_ = -(uint)(pfVar2[1] != 0.0);
                          auVar53._0_4_ = -(uint)(*pfVar2 != 0.0);
                          auVar53._8_4_ = -(uint)(pfVar2[2] != 0.0);
                          auVar53._12_4_ = -(uint)(pfVar2[3] != 0.0);
                          uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar53);
                          if ((((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                               ((uVar74 & 4) == 0)) &&
                              (bVar67 = ((byte)uVar74 & 8) >> 3,
                              psVar69 = (size_t *)(ulong)CONCAT31((int3)(uVar74 >> 8),bVar67),
                              bVar67 == 0)) &&
                             ((bVar11 == false ||
                              ((fVar120 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 0xc),
                               fVar120 == 1.0 && (!NAN(fVar120))))))) {
                            fVar120 = *(float *)*pauVar15;
                            local_178 = *(float *)(*pauVar15 + 4);
                            fVar78 = *(float *)(*pauVar15 + 8);
                            fVar101 = *(float *)(*pauVar15 + 0xc);
                            fVar103 = *(float *)pauVar15[1];
                            fVar116 = *(float *)(pauVar15[1] + 4);
                            fVar119 = *(float *)(pauVar15[1] + 8);
                            fVar100 = *(float *)(pauVar15[1] + 0xc);
                            fVar107 = *(float *)pauVar15[2];
                            fVar125 = *(float *)(pauVar15[2] + 4);
                            fVar91 = *(float *)(pauVar15[2] + 8);
                            fVar96 = *(float *)(pauVar15[2] + 0xc);
                            fVar97 = *(float *)pauVar15[3];
                            fVar113 = *(float *)(pauVar15[3] + 4);
                            fVar117 = *(float *)(pauVar15[3] + 8);
                            fVar104 = *(float *)(pauVar15[3] + 0xc);
                            local_158.quaternion = (bool)bVar60;
                            goto LAB_001628e3;
                          }
                        }
                      }
                    }
                    uVar68 = uVar71 & 0xffffffff;
                    bVar67 = (byte)uVar68 | bVar11;
                    psVar69 = (size_t *)CONCAT71((int7)(uVar68 >> 8),bVar67);
                    if (bVar67 == 0) {
                      fVar117 = *(float *)*pauVar15;
                      fVar127 = *(float *)(*pauVar15 + 4);
                      fVar133 = *(float *)(*pauVar15 + 8);
                      fVar136 = *(float *)(*pauVar15 + 0xc);
                      fVar92 = *(float *)pauVar15[1];
                      fVar93 = *(float *)(pauVar15[1] + 4);
                      fVar94 = *(float *)(pauVar15[1] + 8);
                      fVar95 = *(float *)(pauVar15[1] + 0xc);
                      fVar98 = *(float *)pauVar15[2];
                      fVar99 = *(float *)(pauVar15[2] + 4);
                      fVar134 = *(float *)(pauVar15[2] + 8);
                      fVar102 = *(float *)(pauVar15[2] + 0xc);
                      fVar120 = fVar107 * fVar117 + fVar125 * fVar92 + fVar100 * fVar98;
                      local_178 = fVar107 * fVar127 + fVar125 * fVar93 + fVar100 * fVar99;
                      fVar78 = fVar107 * fVar133 + fVar125 * fVar94 + fVar100 * fVar134;
                      fVar101 = fVar107 * fVar136 + fVar125 * fVar95 + fVar100 * fVar102;
                      fVar100 = *(float *)((long)pAVar16 + lVar73 + -0x20);
                      fVar107 = *(float *)((long)pAVar16 + lVar73 + -0x1c);
                      fVar125 = *(float *)((long)pAVar16 + lVar73 + -0x18);
                      fVar96 = *(float *)((long)pAVar16 + lVar73 + -0x10);
                      fVar103 = fVar100 * fVar117 + fVar107 * fVar92 + fVar125 * fVar98;
                      fVar116 = fVar100 * fVar127 + fVar107 * fVar93 + fVar125 * fVar99;
                      fVar119 = fVar100 * fVar133 + fVar107 * fVar94 + fVar125 * fVar134;
                      fVar100 = fVar100 * fVar136 + fVar107 * fVar95 + fVar125 * fVar102;
                      fVar97 = *(float *)((long)pAVar16 + lVar73 + -0xc);
                      fVar113 = *(float *)((long)pAVar16 + lVar73 + -8);
                      fVar107 = fVar96 * fVar117 + fVar97 * fVar92 + fVar113 * fVar98;
                      fVar125 = fVar96 * fVar127 + fVar97 * fVar93 + fVar113 * fVar99;
                      fVar91 = fVar96 * fVar133 + fVar97 * fVar94 + fVar113 * fVar134;
                      fVar96 = fVar96 * fVar136 + fVar97 * fVar95 + fVar113 * fVar102;
                      fVar104 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                      fVar7 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 4);
                      fVar126 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 8);
                      fVar97 = fVar104 * fVar117 + fVar7 * fVar92 + fVar126 * fVar98 +
                               *(float *)pauVar15[3];
                      fVar113 = fVar104 * fVar127 + fVar7 * fVar93 + fVar126 * fVar99 +
                                *(float *)(pauVar15[3] + 4);
                      fVar117 = fVar104 * fVar133 + fVar7 * fVar94 + fVar126 * fVar134 +
                                *(float *)(pauVar15[3] + 8);
                      fVar104 = fVar104 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102 +
                                *(float *)(pauVar15[3] + 0xc);
                    }
                    else {
                      uVar71 = uVar71 & 0xffffffff;
                      bVar67 = (byte)uVar71 & bVar11;
                      psVar69 = (size_t *)CONCAT71((int7)(uVar71 >> 8),bVar67);
                      if (bVar67 == 1) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                   ,0x67);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                        std::ostream::put(-0x38);
                        std::ostream::flush();
                        fVar78 = *(float *)(pauVar15[3] + 0xc);
                        fVar100 = *(float *)(*pauVar15 + 0xc);
                        fVar107 = *(float *)(pauVar15[1] + 0xc);
                        fVar125 = *(float *)(pauVar15[2] + 0xc);
                        auVar10 = *pauVar15;
                        fVar120 = *(float *)pauVar15[1];
                        fVar101 = *(float *)(pauVar15[1] + 4);
                        fVar103 = *(float *)pauVar15[2];
                        fVar116 = *(float *)(pauVar15[2] + 4);
                        fVar119 = *(float *)(pauVar15[2] + 8);
                        fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                        fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                        fVar97 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                 -fVar125 * fVar125;
                        fVar113 = fVar78 * fVar78 - fVar100 * fVar100;
                        fVar117 = fVar107 * fVar107 + fVar113 + -fVar125 * fVar125;
                        fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                        fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                        fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                        fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                        fVar104 = *(float *)pauVar15[3];
                        fVar7 = *(float *)(pauVar15[3] + 4);
                        fVar126 = *(float *)(pauVar15[3] + 8);
                        fVar127 = fVar127 + fVar127;
                        fVar136 = fVar136 + fVar136;
                        fVar96 = fVar96 + fVar96;
                        fVar133 = fVar133 + fVar133;
                        fVar91 = fVar91 + fVar91;
                        fVar78 = fVar78 + fVar78;
                        fVar100 = fVar125 * fVar125 + fVar113 + -fVar107 * fVar107;
                        fVar111 = fVar97 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                        fVar114 = fVar97 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                        fVar118 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                        fVar123 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                        fVar106 = fVar96 * 1.0 + fVar117 * 0.0 + fVar133 * 0.0;
                        fVar108 = fVar96 * 0.0 + fVar117 * 1.0 + fVar133 * 0.0;
                        fVar109 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 1.0;
                        fVar110 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 0.0;
                        fVar97 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                        fVar113 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                        fVar117 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                        fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                        local_168 = auVar10._4_4_;
                        fStack_164 = auVar10._8_4_;
                        local_178 = auVar10._0_4_;
                        fVar129 = local_178 * fVar111 + fVar106 * 0.0 + fVar97 * 0.0;
                        fVar130 = local_178 * fVar114 + fVar108 * 0.0 + fVar113 * 0.0;
                        fVar131 = local_178 * fVar118 + fVar109 * 0.0 + fVar117 * 0.0;
                        fVar132 = local_178 * fVar123 + fVar110 * 0.0 + fVar92 * 0.0;
                        fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar97 * 0.0;
                        fVar133 = fVar120 * fVar114 + fVar101 * fVar108 + fVar113 * 0.0;
                        fVar136 = fVar120 * fVar118 + fVar101 * fVar109 + fVar117 * 0.0;
                        fVar93 = fVar120 * fVar123 + fVar101 * fVar110 + fVar92 * 0.0;
                        local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar97;
                        fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar113;
                        fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar117;
                        fStack_11c = fVar103 * fVar123 + fVar116 * fVar110 + fVar119 * fVar92;
                        fVar78 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 0xc);
                        fVar100 = *(float *)((long)pAVar16 + lVar73 + -0x24);
                        fVar107 = *(float *)((long)pAVar16 + lVar73 + -0x14);
                        fVar125 = *(float *)((long)pAVar16 + lVar73 + -4);
                        fVar95 = fVar100 * fVar107 + fVar78 * fVar125;
                        fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                        fVar94 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                 -fVar125 * fVar125;
                        fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                        fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                        fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                        fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                        fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                        fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                        pfVar3 = (float *)((long)pAVar16 + lVar73 + -0x30);
                        fVar78 = *pfVar3;
                        pfVar4 = (float *)((long)pAVar16 + lVar73 + -0x20);
                        fVar100 = *pfVar4;
                        fVar120 = pfVar4[1];
                        fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                        pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x10);
                        fVar107 = *pfVar2;
                        fVar125 = pfVar2[1];
                        fVar101 = pfVar2[2];
                        fVar95 = fVar95 + fVar95;
                        fVar134 = fVar134 + fVar134;
                        pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                        fVar103 = *pfVar2;
                        fVar116 = pfVar2[1];
                        fVar119 = pfVar2[2];
                        fVar98 = fVar94 * 1.0 + fVar95 * 0.0 + fVar134 * 0.0;
                        fVar99 = fVar94 * 0.0 + fVar95 * 1.0 + fVar134 * 0.0;
                        fVar134 = fVar94 * 0.0 + fVar95 * 0.0 + fVar134 * 1.0;
                        fVar96 = fVar96 + fVar96;
                        fVar137 = fVar137 + fVar137;
                        fVar102 = fVar102 + fVar102;
                        fVar91 = fVar91 + fVar91;
                        fVar94 = fVar96 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                        fVar95 = fVar96 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                        fVar96 = fVar96 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                        fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                        fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                        fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                        fVar112 = fVar78 * fVar98 + fVar94 * 0.0 + fVar135 * 0.0;
                        fVar115 = fVar78 * fVar99 + fVar95 * 0.0 + fVar137 * 0.0;
                        fVar121 = fVar78 * fVar134 + fVar96 * 0.0 + fVar91 * 0.0;
                        fVar102 = fVar100 * fVar98 + fVar120 * fVar94 + fVar135 * 0.0;
                        fVar122 = fVar100 * fVar99 + fVar120 * fVar95 + fVar137 * 0.0;
                        fVar105 = fVar100 * fVar134 + fVar120 * fVar96 + fVar91 * 0.0;
                        fVar124 = fVar107 * fVar98 + fVar125 * fVar94 + fVar101 * fVar135;
                        fVar128 = fVar107 * fVar99 + fVar125 * fVar95 + fVar101 * fVar137;
                        fVar101 = fVar107 * fVar134 + fVar125 * fVar96 + fVar101 * fVar91;
                        fVar94 = fVar103 * fVar98 + fVar116 * fVar94 + fVar119 * fVar135 +
                                 pfVar3[1] + 0.0;
                        fVar95 = fVar103 * fVar99 + fVar116 * fVar95 + fVar119 * fVar137 +
                                 pfVar3[2] + 0.0;
                        fVar103 = fVar103 * fVar134 + fVar116 * fVar96 + fVar119 * fVar91 +
                                  pfVar4[2] + 0.0;
                        fVar120 = fVar112 * fVar129 + fVar115 * fVar127 + fVar121 * local_128;
                        local_178 = fVar112 * fVar130 + fVar115 * fVar133 + fVar121 * fStack_124;
                        fVar78 = fVar112 * fVar131 + fVar115 * fVar136 + fVar121 * fStack_120;
                        fVar119 = fVar102 * fVar131 + fVar122 * fVar136 + fVar105 * fStack_120;
                        fVar100 = fVar102 * fVar132 + fVar122 * fVar93 + fVar105 * fStack_11c;
                        fVar107 = fVar124 * fVar129 + fVar128 * fVar127 + fVar101 * local_128;
                        fVar125 = fVar124 * fVar130 + fVar128 * fVar133 + fVar101 * fStack_124;
                        fVar91 = fVar124 * fVar131 + fVar128 * fVar136 + fVar101 * fStack_120;
                        psVar69 = extraout_RDX_13;
                        fVar96 = fVar124 * fVar132 + fVar128 * fVar93 + fVar101 * fStack_11c;
                        fVar101 = fVar112 * fVar132 + fVar115 * fVar93 + fVar121 * fStack_11c;
                        fVar97 = fVar94 * fVar129 + fVar95 * fVar127 + fVar103 * local_128 +
                                 fVar104 * fVar111 + fVar7 * fVar106 + fVar126 * fVar97 +
                                 local_168 + 0.0;
                        fVar113 = fVar94 * fVar130 + fVar95 * fVar133 + fVar103 * fStack_124 +
                                  fVar104 * fVar114 + fVar7 * fVar108 + fVar126 * fVar113 +
                                  fStack_164 + 0.0;
                        fVar117 = fVar94 * fVar131 + fVar95 * fVar136 + fVar103 * fStack_120 +
                                  fVar104 * fVar118 + fVar7 * fVar109 + fVar126 * fVar117 +
                                  *(float *)(pauVar15[1] + 8) + 0.0;
                        fVar104 = fVar94 * fVar132 + fVar95 * fVar93 + fVar103 * fStack_11c +
                                  fVar104 * fVar123 + fVar7 * fVar110 + fVar126 * fVar92 + 0.0;
                        fVar103 = fVar102 * fVar129 + fVar122 * fVar127 + fVar105 * local_128;
                        fVar116 = fVar102 * fVar130 + fVar122 * fVar133 + fVar105 * fStack_124;
                      }
                      else {
                        bVar60 = bVar60 ^ 1 | bVar11;
                        if (bVar60 == 0) {
                          local_c8 = ZEXT416(*(uint *)(pauVar15[3] + 0xc));
                          local_a8 = ZEXT416(*(uint *)(*pauVar15 + 0xc));
                          local_d8 = ZEXT416(*(uint *)(pauVar15[2] + 0xc));
                          local_e8 = *(float *)pauVar15[1];
                          fStack_e4 = *(float *)(pauVar15[1] + 4);
                          fStack_dc = *(float *)(pauVar15[1] + 0xc);
                          local_f8 = *(float *)pauVar15[2];
                          fStack_f4 = *(float *)(pauVar15[2] + 4);
                          fStack_f0 = *(float *)(pauVar15[2] + 8);
                          fStack_ec = *(float *)(pauVar15[2] + 0xc);
                          local_b8 = *(undefined8 *)(pauVar15[1] + 8);
                          uStack_b0 = 0;
                          local_88 = *(float *)*pauVar15;
                          fStack_7c = *(float *)(*pauVar15 + 4);
                          pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x30);
                          fVar100 = *pfVar2;
                          fVar107 = pfVar2[1];
                          fVar125 = pfVar2[2];
                          pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x20);
                          fVar101 = *pfVar2;
                          fVar103 = pfVar2[1];
                          fVar116 = pfVar2[2];
                          puVar5 = (undefined8 *)((long)pAVar16 + lVar73 + -0x10);
                          local_108 = *puVar5;
                          uStack_100 = puVar5[1];
                          pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                          fVar119 = *pfVar2;
                          fVar91 = pfVar2[1];
                          fVar96 = pfVar2[2];
                          fVar120 = fVar100 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                          fVar97 = fVar100 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                          fVar100 = fVar100 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                          local_128 = fVar101 * local_88 + fVar103 * local_e8 + fVar116 * local_f8;
                          fStack_124 = fVar101 * 0.0 + fVar103 * fStack_e4 + fVar116 * fStack_f4;
                          fStack_120 = fVar101 * 0.0 + fVar103 * 0.0 + fVar116 * fStack_f0;
                          fStack_11c = fVar101 * fStack_7c +
                                       fVar103 * fStack_dc + fVar116 * fStack_ec;
                          fStack_e0 = 0.0;
                          fStack_84 = 0.0;
                          fStack_80 = 0.0;
                          local_98 = fVar119 * local_88 + fVar91 * local_e8 + fVar96 * local_f8 +
                                     *(float *)pauVar15[3];
                          fStack_94 = fVar119 * 0.0 + fVar91 * fStack_e4 + fVar96 * fStack_f4 +
                                      *(float *)(pauVar15[3] + 4);
                          fStack_90 = fVar119 * 0.0 + fVar91 * 0.0 + fVar96 * fStack_f0 +
                                      *(float *)(pauVar15[3] + 8);
                          fStack_8c = fVar119 * fStack_7c + fVar91 * fStack_dc + fVar96 * fStack_ec
                                      + *(float *)(pauVar15[3] + 0xc);
                          if (((fVar97 != 0.0) || (NAN(fVar97))) ||
                             ((fVar100 != 0.0 ||
                              (((NAN(fVar100) || (fStack_120 != 0.0)) || (NAN(fStack_120))))))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                       ,0x61);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                            std::ostream::put(-0x38);
                            std::ostream::flush();
                            psVar69 = extraout_RDX_15;
                          }
                          fVar107 = local_88 * (float)local_108 +
                                    local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                          fVar125 = fStack_84 * (float)local_108 +
                                    fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                          fVar91 = fStack_80 * (float)local_108 +
                                   fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                          local_158.quaternion = true;
                          fVar119 = (float)local_b8;
                          fVar100 = (float)((ulong)local_b8 >> 0x20);
                          fVar96 = (float)local_d8._0_4_;
                          fVar101 = (float)local_a8._0_4_;
                          fVar97 = local_98;
                          fVar113 = fStack_94;
                          fVar117 = fStack_90;
                          fVar104 = (float)local_c8._0_4_;
                          fVar103 = local_128;
                          fVar116 = fStack_124;
                        }
                        else {
                          if (((local_178 != 0.0) || (NAN(local_178))) ||
                             ((fVar78 != 0.0 ||
                              ((NAN(fVar78) ||
                               (auVar33._4_4_ = -(uint)(*(float *)pauVar15[1] != 0.0),
                               auVar33._0_4_ = -(uint)(*(float *)(pauVar15[1] + 8) != 0.0),
                               auVar33._8_4_ = -(uint)((float)*(undefined8 *)pauVar15[2] != 0.0),
                               auVar33._12_4_ =
                                    -(uint)((float)((ulong)*(undefined8 *)pauVar15[2] >> 0x20) !=
                                           0.0),
                               uVar61 = movmskps((int)CONCAT71(uVar66,bVar60),auVar33),
                               (char)uVar61 != '\0')))))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                       ,0x83);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                            std::ostream::put(-0x38);
                            std::ostream::flush();
                            psVar69 = extraout_RDX_14;
                          }
                          pfVar3 = (float *)((long)pAVar16 + lVar73 + -0x30);
                          pfVar4 = (float *)((long)pAVar16 + lVar73 + -0x20);
                          fVar100 = pfVar4[3];
                          pfVar6 = (float *)((long)pAVar16 + lVar73 + -0x10);
                          fVar107 = *pfVar6;
                          fVar125 = pfVar6[1];
                          pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                          fVar120 = *(float *)*pauVar15 * *pfVar3;
                          local_178 = pfVar3[1] + (float)*(undefined8 *)pauVar15[3];
                          fVar78 = pfVar3[2] + (float)((ulong)*(undefined8 *)pauVar15[3] >> 0x20);
                          fVar119 = pfVar4[2] + *(float *)(pauVar15[3] + 8);
                          fVar91 = pfVar6[2] * *(float *)(pauVar15[2] + 8);
                          local_158.quaternion = true;
                          fVar96 = pfVar6[3];
                          fVar101 = pfVar3[3];
                          fVar97 = *pfVar2;
                          fVar113 = pfVar2[1];
                          fVar117 = pfVar2[2];
                          fVar104 = pfVar2[3];
                          fVar103 = *pfVar4;
                          fVar116 = pfVar4[1] * *(float *)(pauVar15[1] + 4);
                        }
                      }
                    }
                  }
                  else {
                    auVar30._4_4_ = -(uint)(*(float *)pauVar15[1] != 0.0);
                    auVar30._0_4_ = -(uint)(*(float *)(*pauVar15 + 0xc) != 0.0);
                    auVar30._8_4_ = -(uint)(*(float *)(pauVar15[1] + 4) != 1.0);
                    auVar30._12_4_ = -(uint)(*(float *)(pauVar15[1] + 8) != 0.0);
                    uVar74 = movmskps(uVar74,auVar30);
                    if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                       (((uVar74 & 4) != 0 ||
                        (bVar67 = ((byte)uVar74 & 8) >> 3,
                        uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))))
                    goto LAB_00162199;
                    auVar31._4_4_ = -(uint)(*(float *)pauVar15[2] != 0.0);
                    auVar31._0_4_ = -(uint)(*(float *)(pauVar15[1] + 0xc) != 0.0);
                    auVar31._8_4_ = -(uint)(*(float *)(pauVar15[2] + 4) != 0.0);
                    auVar31._12_4_ = -(uint)(*(float *)(pauVar15[2] + 8) != 1.0);
                    uVar74 = movmskps(uVar74,auVar31);
                    if (((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                        ((uVar74 & 4) != 0)) ||
                       (bVar67 = ((byte)uVar74 & 8) >> 3,
                       uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))
                    goto LAB_00162199;
                    auVar32._4_4_ = -(uint)(*(float *)pauVar15[3] != 0.0);
                    auVar32._0_4_ = -(uint)(*(float *)(pauVar15[2] + 0xc) != 0.0);
                    auVar32._8_4_ = -(uint)(*(float *)(pauVar15[3] + 4) != 0.0);
                    auVar32._12_4_ = -(uint)(*(float *)(pauVar15[3] + 8) != 0.0);
                    uVar74 = movmskps(uVar74,auVar32);
                    if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                       ((uVar74 & 4) != 0)) goto LAB_00162199;
                    bVar67 = ((byte)uVar74 & 8) >> 3;
                    uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                    psVar69 = (size_t *)(ulong)uVar74;
                    if ((bVar67 != 0) ||
                       ((bVar60 != 0 &&
                        ((*(float *)(pauVar15[3] + 0xc) != 1.0 ||
                         (NAN(*(float *)(pauVar15[3] + 0xc)))))))) goto LAB_00162199;
                    pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x30);
                    fVar120 = *pfVar2;
                    local_178 = pfVar2[1];
                    fVar78 = pfVar2[2];
                    fVar101 = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x20);
                    fVar103 = *pfVar2;
                    fVar116 = pfVar2[1];
                    fVar119 = pfVar2[2];
                    fVar100 = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x10);
                    fVar107 = *pfVar2;
                    fVar125 = pfVar2[1];
                    fVar91 = pfVar2[2];
                    fVar96 = pfVar2[3];
                    pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                    fVar97 = *pfVar2;
                    fVar113 = pfVar2[1];
                    fVar117 = pfVar2[2];
                    fVar104 = pfVar2[3];
                    local_158.quaternion = bVar11;
                  }
LAB_001628e3:
                  pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
                  *pfVar2 = fVar120;
                  pfVar2[1] = local_178;
                  pfVar2[2] = fVar78;
                  pfVar2[3] = fVar101;
                  pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
                  *pfVar2 = fVar103;
                  pfVar2[1] = fVar116;
                  pfVar2[2] = fVar119;
                  pfVar2[3] = fVar100;
                  pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
                  *pfVar2 = fVar107;
                  pfVar2[1] = fVar125;
                  pfVar2[2] = fVar91;
                  pfVar2[3] = fVar96;
                  pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
                  *pfVar2 = fVar97;
                  pfVar2[1] = fVar113;
                  pfVar2[2] = fVar117;
                  pfVar2[3] = fVar104;
                  uVar70 = uVar70 + 1;
                  lVar73 = lVar73 + 0x40;
                  pAVar64 = local_158.spaces.items;
                } while (uVar70 < (spaces->spaces).size_active);
              }
            }
            else {
              sVar17 = (spaces->spaces).size_active;
              if (sVar17 == 1) {
                uVar8 = *(undefined8 *)&(pLVar1->vx).field_0;
                fVar78 = (float)uVar8;
                fVar100 = (float)((ulong)uVar8 >> 0x20);
                fVar107 = (spaces->time_range).lower;
                fVar125 = (spaces->time_range).upper;
                uVar74 = -(uint)(fVar78 < fVar107);
                uVar76 = -(uint)(fVar100 < fVar125);
                local_158.time_range.upper =
                     (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76);
                local_158.time_range.lower =
                     (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
                local_158.spaces.size_active = 0;
                local_158.spaces.size_alloced = 0;
                local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
                if (sVar13 != 0) {
                  local_158.spaces.items =
                       (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                       alignedMalloc(sVar13 << 6,0x10);
                  psVar69 = extraout_RDX_16;
                  local_158.spaces.size_alloced = sVar13;
                }
                pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
                if (*(char *)((long)&(pLVar1->vz).field_0 + 8) == '\0') {
                  pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                            (ulong)*(uint *)&spaces->quaternion;
                }
                local_158.quaternion = SUB81(pAVar64,0);
                local_158.spaces.size_active = local_158.spaces.size_alloced;
                if (*(long *)&(pLVar1->vy).field_0 != 0) {
                  lVar73 = 0x30;
                  uVar70 = 0;
                  do {
                    uVar74 = (uint)psVar69;
                    lVar14 = *(long *)&(pLVar1->vz).field_0;
                    pAVar16 = (spaces->spaces).items;
                    bVar60 = *(byte *)((long)&(pLVar1->vz).field_0 + 8);
                    uVar66 = (undefined7)((ulong)pAVar64 >> 8);
                    uVar71 = CONCAT71(uVar66,bVar60);
                    bVar11 = spaces->quaternion;
                    local_158.quaternion = false;
                    fVar78 = *(float *)(lVar14 + -0x30 + lVar73);
                    uVar8 = *(undefined8 *)(lVar14 + -0x2c + lVar73);
                    fVar100 = (float)((ulong)uVar8 >> 0x20);
                    local_178 = (float)uVar8;
                    if (((((fVar78 != 1.0) || (NAN(fVar78))) || (local_178 != 0.0)) ||
                        ((NAN(local_178) || (fVar100 != 0.0)))) || (NAN(fVar100))) {
LAB_00162e4e:
                      uVar8 = *(undefined8 *)&(pAVar16->l).vx.field_0;
                      fVar107 = (float)uVar8;
                      fVar125 = (float)((ulong)uVar8 >> 0x20);
                      iVar75 = -(uint)(fVar107 != 1.0);
                      iVar77 = -(uint)(fVar125 != 0.0);
                      auVar88._4_4_ = iVar77;
                      auVar88._0_4_ = iVar75;
                      auVar88._8_4_ = iVar77;
                      auVar88._12_4_ = iVar77;
                      auVar87._8_8_ = auVar88._8_8_;
                      auVar87._4_4_ = iVar75;
                      auVar87._0_4_ = iVar75;
                      uVar74 = movmskpd(uVar74,auVar87);
                      fVar78 = (pAVar16->l).vx.field_0.m128[2];
                      if (((uVar74 & 1) == 0) &&
                         (((bVar67 = (byte)uVar74 >> 1, bVar67 == 0 && (fVar78 == 0.0)) &&
                          (!NAN(fVar78))))) {
                        auVar54._4_4_ = -(uint)((pAVar16->l).vy.field_0.m128[0] != 0.0);
                        auVar54._0_4_ = -(uint)((pAVar16->l).vx.field_0.m128[3] != 0.0);
                        auVar54._8_4_ = -(uint)((pAVar16->l).vy.field_0.m128[1] != 1.0);
                        auVar54._12_4_ = -(uint)((pAVar16->l).vy.field_0.m128[2] != 0.0);
                        uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar54);
                        if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                           (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0))))
                        {
                          auVar55._4_4_ = -(uint)((pAVar16->l).vz.field_0.m128[0] != 0.0);
                          auVar55._0_4_ = -(uint)((pAVar16->l).vy.field_0.m128[3] != 0.0);
                          auVar55._8_4_ = -(uint)((pAVar16->l).vz.field_0.m128[1] != 0.0);
                          auVar55._12_4_ = -(uint)((pAVar16->l).vz.field_0.m128[2] != 1.0);
                          uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar55);
                          if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                             (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0))
                             )) {
                            auVar56._4_4_ = -(uint)((pAVar16->p).field_0.m128[0] != 0.0);
                            auVar56._0_4_ = -(uint)((pAVar16->l).vz.field_0.m128[3] != 0.0);
                            auVar56._8_4_ = -(uint)((pAVar16->p).field_0.m128[1] != 0.0);
                            auVar56._12_4_ = -(uint)((pAVar16->p).field_0.m128[2] != 0.0);
                            uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar56);
                            if ((((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                                 ((uVar74 & 4) == 0)) &&
                                (bVar67 = ((byte)uVar74 & 8) >> 3,
                                psVar69 = (size_t *)(ulong)CONCAT31((int3)(uVar74 >> 8),bVar67),
                                bVar67 == 0)) &&
                               ((bVar11 == false ||
                                ((fVar120 = (pAVar16->p).field_0.m128[3], fVar120 == 1.0 &&
                                 (!NAN(fVar120))))))) {
                              pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                              fVar120 = *pfVar2;
                              local_178 = pfVar2[1];
                              fVar100 = pfVar2[2];
                              fVar101 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                              fVar103 = *pfVar2;
                              fVar116 = pfVar2[1];
                              fVar119 = pfVar2[2];
                              fVar78 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                              fVar107 = *pfVar2;
                              fVar125 = pfVar2[1];
                              fVar91 = pfVar2[2];
                              fVar96 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + lVar73);
                              fVar97 = *pfVar2;
                              fVar113 = pfVar2[1];
                              fVar117 = pfVar2[2];
                              fVar104 = pfVar2[3];
                              local_158.quaternion = (bool)bVar60;
                              goto LAB_001635ad;
                            }
                          }
                        }
                      }
                      uVar68 = uVar71 & 0xffffffff;
                      bVar67 = (byte)uVar68 | bVar11;
                      psVar69 = (size_t *)CONCAT71((int7)(uVar68 >> 8),bVar67);
                      if (bVar67 == 0) {
                        pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                        fVar117 = *pfVar2;
                        fVar127 = pfVar2[1];
                        fVar133 = pfVar2[2];
                        fVar136 = pfVar2[3];
                        pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                        fVar92 = *pfVar2;
                        fVar93 = pfVar2[1];
                        fVar94 = pfVar2[2];
                        fVar95 = pfVar2[3];
                        pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                        fVar98 = *pfVar2;
                        fVar99 = pfVar2[1];
                        fVar134 = pfVar2[2];
                        fVar102 = pfVar2[3];
                        fVar120 = fVar107 * fVar117 + fVar125 * fVar92 + fVar78 * fVar98;
                        local_178 = fVar107 * fVar127 + fVar125 * fVar93 + fVar78 * fVar99;
                        fVar100 = fVar107 * fVar133 + fVar125 * fVar94 + fVar78 * fVar134;
                        fVar101 = fVar107 * fVar136 + fVar125 * fVar95 + fVar78 * fVar102;
                        fVar78 = (pAVar16->l).vy.field_0.m128[0];
                        fVar107 = (pAVar16->l).vy.field_0.m128[1];
                        fVar125 = (pAVar16->l).vy.field_0.m128[2];
                        fVar96 = (pAVar16->l).vz.field_0.m128[0];
                        fVar103 = fVar78 * fVar117 + fVar107 * fVar92 + fVar125 * fVar98;
                        fVar116 = fVar78 * fVar127 + fVar107 * fVar93 + fVar125 * fVar99;
                        fVar119 = fVar78 * fVar133 + fVar107 * fVar94 + fVar125 * fVar134;
                        fVar78 = fVar78 * fVar136 + fVar107 * fVar95 + fVar125 * fVar102;
                        fVar97 = (pAVar16->l).vz.field_0.m128[1];
                        fVar113 = (pAVar16->l).vz.field_0.m128[2];
                        fVar107 = fVar96 * fVar117 + fVar97 * fVar92 + fVar113 * fVar98;
                        fVar125 = fVar96 * fVar127 + fVar97 * fVar93 + fVar113 * fVar99;
                        fVar91 = fVar96 * fVar133 + fVar97 * fVar94 + fVar113 * fVar134;
                        fVar96 = fVar96 * fVar136 + fVar97 * fVar95 + fVar113 * fVar102;
                        fVar104 = (pAVar16->p).field_0.m128[0];
                        fVar7 = (pAVar16->p).field_0.m128[1];
                        fVar126 = (pAVar16->p).field_0.m128[2];
                        pfVar2 = (float *)(lVar14 + lVar73);
                        fVar97 = fVar104 * fVar117 + fVar7 * fVar92 + fVar126 * fVar98 + *pfVar2;
                        fVar113 = fVar104 * fVar127 + fVar7 * fVar93 + fVar126 * fVar99 + pfVar2[1];
                        fVar117 = fVar104 * fVar133 + fVar7 * fVar94 + fVar126 * fVar134 + pfVar2[2]
                        ;
                        fVar104 = fVar104 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102 + pfVar2[3]
                        ;
                      }
                      else {
                        uVar71 = uVar71 & 0xffffffff;
                        bVar67 = (byte)uVar71 & bVar11;
                        psVar69 = (size_t *)CONCAT71((int7)(uVar71 >> 8),bVar67);
                        if (bVar67 == 1) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                     ,0x67);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          fVar78 = *(float *)(lVar14 + 0xc + lVar73);
                          fVar100 = *(float *)(lVar14 + -0x24 + lVar73);
                          fVar107 = *(float *)(lVar14 + -0x14 + lVar73);
                          fVar125 = *(float *)(lVar14 + -4 + lVar73);
                          auVar10 = *(undefined1 (*) [16])(lVar14 + -0x30 + lVar73);
                          pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                          fVar120 = *pfVar2;
                          fVar101 = pfVar2[1];
                          pfVar3 = (float *)(lVar14 + -0x10 + lVar73);
                          fVar103 = *pfVar3;
                          fVar116 = pfVar3[1];
                          fVar119 = pfVar3[2];
                          fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                          fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                          fVar97 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                   -fVar125 * fVar125;
                          fVar113 = fVar78 * fVar78 - fVar100 * fVar100;
                          fVar117 = fVar107 * fVar107 + fVar113 + -fVar125 * fVar125;
                          fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                          fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                          fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                          fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                          pfVar3 = (float *)(lVar14 + lVar73);
                          fVar104 = *pfVar3;
                          fVar7 = pfVar3[1];
                          fVar126 = pfVar3[2];
                          fVar127 = fVar127 + fVar127;
                          fVar136 = fVar136 + fVar136;
                          fVar96 = fVar96 + fVar96;
                          fVar133 = fVar133 + fVar133;
                          fVar91 = fVar91 + fVar91;
                          fVar78 = fVar78 + fVar78;
                          fVar100 = fVar125 * fVar125 + fVar113 + -fVar107 * fVar107;
                          fVar111 = fVar97 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                          fVar114 = fVar97 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                          fVar118 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                          fVar123 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                          fVar106 = fVar96 * 1.0 + fVar117 * 0.0 + fVar133 * 0.0;
                          fVar108 = fVar96 * 0.0 + fVar117 * 1.0 + fVar133 * 0.0;
                          fVar109 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 1.0;
                          fVar110 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 0.0;
                          fVar97 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                          fVar113 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                          fVar117 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                          fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                          local_168 = auVar10._4_4_;
                          fStack_164 = auVar10._8_4_;
                          local_178 = auVar10._0_4_;
                          fVar129 = local_178 * fVar111 + fVar106 * 0.0 + fVar97 * 0.0;
                          fVar130 = local_178 * fVar114 + fVar108 * 0.0 + fVar113 * 0.0;
                          fVar131 = local_178 * fVar118 + fVar109 * 0.0 + fVar117 * 0.0;
                          fVar132 = local_178 * fVar123 + fVar110 * 0.0 + fVar92 * 0.0;
                          fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar97 * 0.0;
                          fVar133 = fVar120 * fVar114 + fVar101 * fVar108 + fVar113 * 0.0;
                          fVar136 = fVar120 * fVar118 + fVar101 * fVar109 + fVar117 * 0.0;
                          fVar93 = fVar120 * fVar123 + fVar101 * fVar110 + fVar92 * 0.0;
                          local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar97;
                          fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar113;
                          fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar117;
                          fStack_11c = fVar103 * fVar123 + fVar116 * fVar110 + fVar119 * fVar92;
                          fVar78 = (pAVar16->p).field_0.m128[3];
                          fVar100 = (pAVar16->l).vx.field_0.m128[3];
                          fVar107 = (pAVar16->l).vy.field_0.m128[3];
                          fVar125 = (pAVar16->l).vz.field_0.m128[3];
                          fVar95 = fVar100 * fVar107 + fVar78 * fVar125;
                          fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                          fVar94 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                   -fVar125 * fVar125;
                          fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                          fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                          fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                          fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                          fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                          fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                          fVar78 = (pAVar16->l).vx.field_0.m128[0];
                          fVar100 = (pAVar16->l).vy.field_0.m128[0];
                          fVar120 = (pAVar16->l).vy.field_0.m128[1];
                          fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                          fVar107 = (pAVar16->l).vz.field_0.m128[0];
                          fVar125 = (pAVar16->l).vz.field_0.m128[1];
                          fVar101 = (pAVar16->l).vz.field_0.m128[2];
                          fVar95 = fVar95 + fVar95;
                          fVar134 = fVar134 + fVar134;
                          fVar103 = (pAVar16->p).field_0.m128[0];
                          fVar116 = (pAVar16->p).field_0.m128[1];
                          fVar119 = (pAVar16->p).field_0.m128[2];
                          fVar98 = fVar94 * 1.0 + fVar95 * 0.0 + fVar134 * 0.0;
                          fVar99 = fVar94 * 0.0 + fVar95 * 1.0 + fVar134 * 0.0;
                          fVar134 = fVar94 * 0.0 + fVar95 * 0.0 + fVar134 * 1.0;
                          fVar96 = fVar96 + fVar96;
                          fVar137 = fVar137 + fVar137;
                          fVar102 = fVar102 + fVar102;
                          fVar91 = fVar91 + fVar91;
                          fVar94 = fVar96 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                          fVar95 = fVar96 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                          fVar96 = fVar96 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                          fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                          fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                          fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                          fVar112 = fVar78 * fVar98 + fVar94 * 0.0 + fVar135 * 0.0;
                          fVar115 = fVar78 * fVar99 + fVar95 * 0.0 + fVar137 * 0.0;
                          fVar121 = fVar78 * fVar134 + fVar96 * 0.0 + fVar91 * 0.0;
                          fVar102 = fVar100 * fVar98 + fVar120 * fVar94 + fVar135 * 0.0;
                          fVar122 = fVar100 * fVar99 + fVar120 * fVar95 + fVar137 * 0.0;
                          fVar105 = fVar100 * fVar134 + fVar120 * fVar96 + fVar91 * 0.0;
                          fVar124 = fVar107 * fVar98 + fVar125 * fVar94 + fVar101 * fVar135;
                          fVar128 = fVar107 * fVar99 + fVar125 * fVar95 + fVar101 * fVar137;
                          fVar101 = fVar107 * fVar134 + fVar125 * fVar96 + fVar101 * fVar91;
                          fVar94 = fVar103 * fVar98 + fVar116 * fVar94 + fVar119 * fVar135 +
                                   (pAVar16->l).vx.field_0.m128[1] + 0.0;
                          fVar95 = fVar103 * fVar99 + fVar116 * fVar95 + fVar119 * fVar137 +
                                   (pAVar16->l).vx.field_0.m128[2] + 0.0;
                          fVar103 = fVar103 * fVar134 + fVar116 * fVar96 + fVar119 * fVar91 +
                                    (pAVar16->l).vy.field_0.m128[2] + 0.0;
                          fVar120 = fVar112 * fVar129 + fVar115 * fVar127 + fVar121 * local_128;
                          local_178 = fVar112 * fVar130 + fVar115 * fVar133 + fVar121 * fStack_124;
                          fVar100 = fVar112 * fVar131 + fVar115 * fVar136 + fVar121 * fStack_120;
                          fVar119 = fVar102 * fVar131 + fVar122 * fVar136 + fVar105 * fStack_120;
                          fVar78 = fVar102 * fVar132 + fVar122 * fVar93 + fVar105 * fStack_11c;
                          fVar107 = fVar124 * fVar129 + fVar128 * fVar127 + fVar101 * local_128;
                          fVar125 = fVar124 * fVar130 + fVar128 * fVar133 + fVar101 * fStack_124;
                          fVar91 = fVar124 * fVar131 + fVar128 * fVar136 + fVar101 * fStack_120;
                          psVar69 = extraout_RDX_17;
                          fVar96 = fVar124 * fVar132 + fVar128 * fVar93 + fVar101 * fStack_11c;
                          fVar101 = fVar112 * fVar132 + fVar115 * fVar93 + fVar121 * fStack_11c;
                          fVar97 = fVar94 * fVar129 + fVar95 * fVar127 + fVar103 * local_128 +
                                   fVar104 * fVar111 + fVar7 * fVar106 + fVar126 * fVar97 +
                                   local_168 + 0.0;
                          fVar113 = fVar94 * fVar130 + fVar95 * fVar133 + fVar103 * fStack_124 +
                                    fVar104 * fVar114 + fVar7 * fVar108 + fVar126 * fVar113 +
                                    fStack_164 + 0.0;
                          fVar117 = fVar94 * fVar131 + fVar95 * fVar136 + fVar103 * fStack_120 +
                                    fVar104 * fVar118 + fVar7 * fVar109 + fVar126 * fVar117 +
                                    pfVar2[2] + 0.0;
                          fVar104 = fVar94 * fVar132 + fVar95 * fVar93 + fVar103 * fStack_11c +
                                    fVar104 * fVar123 + fVar7 * fVar110 + fVar126 * fVar92 + 0.0;
                          fVar103 = fVar102 * fVar129 + fVar122 * fVar127 + fVar105 * local_128;
                          fVar116 = fVar102 * fVar130 + fVar122 * fVar133 + fVar105 * fStack_124;
                        }
                        else {
                          bVar60 = bVar60 ^ 1 | bVar11;
                          if (bVar60 == 0) {
                            local_c8 = ZEXT416(*(uint *)(lVar14 + 0xc + lVar73));
                            local_a8 = ZEXT416(*(uint *)(lVar14 + -0x24 + lVar73));
                            local_d8 = ZEXT416(*(uint *)(lVar14 + -4 + lVar73));
                            pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                            local_e8 = *pfVar2;
                            fStack_e4 = pfVar2[1];
                            fStack_dc = pfVar2[3];
                            pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                            local_f8 = *pfVar2;
                            fStack_f4 = pfVar2[1];
                            fStack_f0 = pfVar2[2];
                            fStack_ec = pfVar2[3];
                            local_b8 = *(undefined8 *)(lVar14 + -0x18 + lVar73);
                            uStack_b0 = 0;
                            pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                            local_88 = *pfVar2;
                            fStack_7c = pfVar2[1];
                            fVar78 = (pAVar16->l).vx.field_0.m128[0];
                            fVar107 = (pAVar16->l).vx.field_0.m128[1];
                            fVar125 = (pAVar16->l).vx.field_0.m128[2];
                            fVar101 = (pAVar16->l).vy.field_0.m128[0];
                            fVar103 = (pAVar16->l).vy.field_0.m128[1];
                            fVar116 = (pAVar16->l).vy.field_0.m128[2];
                            local_108 = *(undefined8 *)&(pAVar16->l).vz.field_0;
                            uStack_100 = *(undefined8 *)((long)&(pAVar16->l).vz.field_0 + 8);
                            fVar119 = (pAVar16->p).field_0.m128[0];
                            fVar91 = (pAVar16->p).field_0.m128[1];
                            fVar96 = (pAVar16->p).field_0.m128[2];
                            fVar120 = fVar78 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                            fVar97 = fVar78 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                            fVar78 = fVar78 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                            local_128 = fVar101 * local_88 + fVar103 * local_e8 + fVar116 * local_f8
                            ;
                            fStack_124 = fVar101 * 0.0 + fVar103 * fStack_e4 + fVar116 * fStack_f4;
                            fStack_120 = fVar101 * 0.0 + fVar103 * 0.0 + fVar116 * fStack_f0;
                            fStack_11c = fVar101 * fStack_7c +
                                         fVar103 * fStack_dc + fVar116 * fStack_ec;
                            fStack_e0 = 0.0;
                            fStack_84 = 0.0;
                            fStack_80 = 0.0;
                            pfVar2 = (float *)(lVar14 + lVar73);
                            local_98 = fVar119 * local_88 + fVar91 * local_e8 + fVar96 * local_f8 +
                                       *pfVar2;
                            fStack_94 = fVar119 * 0.0 + fVar91 * fStack_e4 + fVar96 * fStack_f4 +
                                        pfVar2[1];
                            fStack_90 = fVar119 * 0.0 + fVar91 * 0.0 + fVar96 * fStack_f0 +
                                        pfVar2[2];
                            fStack_8c = fVar119 * fStack_7c +
                                        fVar91 * fStack_dc + fVar96 * fStack_ec + pfVar2[3];
                            if (((fVar97 != 0.0) || (NAN(fVar97))) ||
                               ((fVar78 != 0.0 ||
                                (((NAN(fVar78) || (fStack_120 != 0.0)) || (NAN(fStack_120))))))) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                         ,0x61);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                              std::ostream::put(-0x38);
                              std::ostream::flush();
                              psVar69 = extraout_RDX_19;
                            }
                            fVar107 = local_88 * (float)local_108 +
                                      local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                            fVar125 = fStack_84 * (float)local_108 +
                                      fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                            fVar91 = fStack_80 * (float)local_108 +
                                     fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                            local_158.quaternion = true;
                            fVar119 = (float)local_b8;
                            fVar78 = (float)((ulong)local_b8 >> 0x20);
                            fVar96 = (float)local_d8._0_4_;
                            fVar101 = (float)local_a8._0_4_;
                            fVar97 = local_98;
                            fVar113 = fStack_94;
                            fVar117 = fStack_90;
                            fVar104 = (float)local_c8._0_4_;
                            fVar103 = local_128;
                            fVar116 = fStack_124;
                          }
                          else {
                            if (((local_178 != 0.0) || (NAN(local_178))) ||
                               ((fVar100 != 0.0 ||
                                ((NAN(fVar100) ||
                                 (uVar8 = *(undefined8 *)(lVar14 + -0x10 + lVar73),
                                 auVar37._4_4_ = -(uint)(*(float *)(lVar14 + -0x20 + lVar73) != 0.0)
                                 , auVar37._0_4_ =
                                        -(uint)(*(float *)(lVar14 + -0x18 + lVar73) != 0.0),
                                 auVar37._8_4_ = -(uint)((float)uVar8 != 0.0),
                                 auVar37._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                                 uVar61 = movmskps((int)CONCAT71(uVar66,bVar60),auVar37),
                                 (char)uVar61 != '\0')))))) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                         ,0x83);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                              std::ostream::put(-0x38);
                              std::ostream::flush();
                              psVar69 = extraout_RDX_18;
                            }
                            fVar78 = (pAVar16->l).vy.field_0.m128[3];
                            fVar107 = (pAVar16->l).vz.field_0.m128[0];
                            fVar125 = (pAVar16->l).vz.field_0.m128[1];
                            fVar120 = *(float *)(lVar14 + -0x30 + lVar73) *
                                      (pAVar16->l).vx.field_0.m128[0];
                            local_178 = (pAVar16->l).vx.field_0.m128[1] +
                                        (float)*(undefined8 *)(lVar14 + lVar73);
                            fVar100 = (pAVar16->l).vx.field_0.m128[2] +
                                      (float)((ulong)*(undefined8 *)(lVar14 + lVar73) >> 0x20);
                            fVar119 = (pAVar16->l).vy.field_0.m128[2] +
                                      *(float *)(lVar14 + 8 + lVar73);
                            fVar91 = (pAVar16->l).vz.field_0.m128[2] *
                                     *(float *)(lVar14 + -8 + lVar73);
                            local_158.quaternion = true;
                            fVar96 = (pAVar16->l).vz.field_0.m128[3];
                            fVar101 = (pAVar16->l).vx.field_0.m128[3];
                            fVar97 = (pAVar16->p).field_0.m128[0];
                            fVar113 = (pAVar16->p).field_0.m128[1];
                            fVar117 = (pAVar16->p).field_0.m128[2];
                            fVar104 = (pAVar16->p).field_0.m128[3];
                            fVar103 = (pAVar16->l).vy.field_0.m128[0];
                            fVar116 = (pAVar16->l).vy.field_0.m128[1] *
                                      *(float *)(lVar14 + -0x1c + lVar73);
                          }
                        }
                      }
                    }
                    else {
                      pfVar2 = (float *)(lVar14 + -0x24 + lVar73);
                      auVar34._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar34._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar34._8_4_ = -(uint)(pfVar2[2] != 1.0);
                      auVar34._12_4_ = -(uint)(pfVar2[3] != 0.0);
                      uVar74 = movmskps(uVar74,auVar34);
                      if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                         (((uVar74 & 4) != 0 ||
                          (bVar67 = ((byte)uVar74 & 8) >> 3,
                          uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))))
                      goto LAB_00162e4e;
                      pfVar2 = (float *)(lVar14 + -0x14 + lVar73);
                      auVar35._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar35._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar35._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar35._12_4_ = -(uint)(pfVar2[3] != 1.0);
                      uVar74 = movmskps(uVar74,auVar35);
                      if (((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                          ((uVar74 & 4) != 0)) ||
                         (bVar67 = ((byte)uVar74 & 8) >> 3,
                         uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))
                      goto LAB_00162e4e;
                      pfVar2 = (float *)(lVar14 + -4 + lVar73);
                      auVar36._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar36._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar36._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar36._12_4_ = -(uint)(pfVar2[3] != 0.0);
                      uVar74 = movmskps(uVar74,auVar36);
                      if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                         ((uVar74 & 4) != 0)) goto LAB_00162e4e;
                      bVar67 = ((byte)uVar74 & 8) >> 3;
                      uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                      psVar69 = (size_t *)(ulong)uVar74;
                      if ((bVar67 != 0) ||
                         ((bVar60 != 0 &&
                          ((fVar78 = *(float *)(lVar14 + 0xc + lVar73), fVar78 != 1.0 ||
                           (NAN(fVar78))))))) goto LAB_00162e4e;
                      fVar120 = (pAVar16->l).vx.field_0.m128[0];
                      local_178 = (pAVar16->l).vx.field_0.m128[1];
                      fVar100 = (pAVar16->l).vx.field_0.m128[2];
                      fVar101 = (pAVar16->l).vx.field_0.m128[3];
                      fVar103 = (pAVar16->l).vy.field_0.m128[0];
                      fVar116 = (pAVar16->l).vy.field_0.m128[1];
                      fVar119 = (pAVar16->l).vy.field_0.m128[2];
                      fVar78 = (pAVar16->l).vy.field_0.m128[3];
                      fVar107 = (pAVar16->l).vz.field_0.m128[0];
                      fVar125 = (pAVar16->l).vz.field_0.m128[1];
                      fVar91 = (pAVar16->l).vz.field_0.m128[2];
                      fVar96 = (pAVar16->l).vz.field_0.m128[3];
                      fVar97 = (pAVar16->p).field_0.m128[0];
                      fVar113 = (pAVar16->p).field_0.m128[1];
                      fVar117 = (pAVar16->p).field_0.m128[2];
                      fVar104 = (pAVar16->p).field_0.m128[3];
                      local_158.quaternion = bVar11;
                    }
LAB_001635ad:
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
                    *pfVar2 = fVar120;
                    pfVar2[1] = local_178;
                    pfVar2[2] = fVar100;
                    pfVar2[3] = fVar101;
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
                    *pfVar2 = fVar103;
                    pfVar2[1] = fVar116;
                    pfVar2[2] = fVar119;
                    pfVar2[3] = fVar78;
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
                    *pfVar2 = fVar107;
                    pfVar2[1] = fVar125;
                    pfVar2[2] = fVar91;
                    pfVar2[3] = fVar96;
                    pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
                    *pfVar2 = fVar97;
                    pfVar2[1] = fVar113;
                    pfVar2[2] = fVar117;
                    pfVar2[3] = fVar104;
                    uVar70 = uVar70 + 1;
                    lVar73 = lVar73 + 0x40;
                    pAVar64 = local_158.spaces.items;
                  } while (uVar70 < *(ulong *)&(pLVar1->vy).field_0);
                }
              }
              else {
                if (sVar13 != sVar17) {
                  prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar65,"number of transformations does not match");
                  __cxa_throw(prVar65,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar8 = *(undefined8 *)&(pLVar1->vx).field_0;
                fVar78 = (float)uVar8;
                fVar100 = (float)((ulong)uVar8 >> 0x20);
                fVar107 = (spaces->time_range).lower;
                fVar125 = (spaces->time_range).upper;
                uVar74 = -(uint)(fVar78 < fVar107);
                uVar76 = -(uint)(fVar100 < fVar125);
                local_158.time_range.upper =
                     (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76);
                local_158.time_range.lower =
                     (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
                local_158.spaces.size_active = 0;
                local_158.spaces.size_alloced = 0;
                local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
                if (sVar13 != 0) {
                  local_158.spaces.items =
                       (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                       alignedMalloc(sVar13 << 6,0x10);
                  psVar69 = extraout_RDX_20;
                  local_158.spaces.size_alloced = sVar13;
                }
                pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
                if (*(char *)((long)&(pLVar1->vz).field_0 + 8) == '\0') {
                  pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                            (ulong)*(uint *)&spaces->quaternion;
                }
                local_158.quaternion = SUB81(pAVar64,0);
                local_158.spaces.size_active = local_158.spaces.size_alloced;
                if (*(long *)&(pLVar1->vy).field_0 != 0) {
                  lVar73 = 0x30;
                  uVar70 = 0;
                  do {
                    uVar74 = (uint)psVar69;
                    lVar14 = *(long *)&(pLVar1->vz).field_0;
                    pAVar16 = (spaces->spaces).items;
                    bVar60 = *(byte *)((long)&(pLVar1->vz).field_0 + 8);
                    uVar66 = (undefined7)((ulong)pAVar64 >> 8);
                    uVar71 = CONCAT71(uVar66,bVar60);
                    bVar11 = spaces->quaternion;
                    local_158.quaternion = false;
                    fVar78 = *(float *)(lVar14 + -0x30 + lVar73);
                    uVar8 = *(undefined8 *)(lVar14 + -0x2c + lVar73);
                    fVar100 = (float)((ulong)uVar8 >> 0x20);
                    local_178 = (float)uVar8;
                    if ((((fVar78 != 1.0) || (NAN(fVar78))) || (local_178 != 0.0)) ||
                       (((NAN(local_178) || (fVar100 != 0.0)) || (NAN(fVar100))))) {
LAB_00163b39:
                      uVar8 = *(undefined8 *)((long)pAVar16 + lVar73 + -0x30);
                      fVar107 = (float)uVar8;
                      fVar125 = (float)((ulong)uVar8 >> 0x20);
                      iVar75 = -(uint)(fVar107 != 1.0);
                      iVar77 = -(uint)(fVar125 != 0.0);
                      auVar90._4_4_ = iVar77;
                      auVar90._0_4_ = iVar75;
                      auVar90._8_4_ = iVar77;
                      auVar90._12_4_ = iVar77;
                      auVar89._8_8_ = auVar90._8_8_;
                      auVar89._4_4_ = iVar75;
                      auVar89._0_4_ = iVar75;
                      uVar74 = movmskpd(uVar74,auVar89);
                      fVar78 = *(float *)((long)pAVar16 + lVar73 + -0x28);
                      if (((uVar74 & 1) == 0) &&
                         (((bVar67 = (byte)uVar74 >> 1, bVar67 == 0 && (fVar78 == 0.0)) &&
                          (!NAN(fVar78))))) {
                        pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x24);
                        auVar57._4_4_ = -(uint)(pfVar2[1] != 0.0);
                        auVar57._0_4_ = -(uint)(*pfVar2 != 0.0);
                        auVar57._8_4_ = -(uint)(pfVar2[2] != 1.0);
                        auVar57._12_4_ = -(uint)(pfVar2[3] != 0.0);
                        uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar57);
                        if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                           (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0))))
                        {
                          pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x14);
                          auVar58._4_4_ = -(uint)(pfVar2[1] != 0.0);
                          auVar58._0_4_ = -(uint)(*pfVar2 != 0.0);
                          auVar58._8_4_ = -(uint)(pfVar2[2] != 0.0);
                          auVar58._12_4_ = -(uint)(pfVar2[3] != 1.0);
                          uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar58);
                          if ((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                             (((uVar74 & 4) == 0 && (bVar67 = ((byte)uVar74 & 8) >> 3, bVar67 == 0))
                             )) {
                            pfVar2 = (float *)((long)pAVar16 + lVar73 + -4);
                            auVar59._4_4_ = -(uint)(pfVar2[1] != 0.0);
                            auVar59._0_4_ = -(uint)(*pfVar2 != 0.0);
                            auVar59._8_4_ = -(uint)(pfVar2[2] != 0.0);
                            auVar59._12_4_ = -(uint)(pfVar2[3] != 0.0);
                            uVar74 = movmskps(CONCAT31((int3)(uVar74 >> 8),bVar67),auVar59);
                            if ((((((bVar11 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                                 ((uVar74 & 4) == 0)) &&
                                (bVar67 = ((byte)uVar74 & 8) >> 3,
                                psVar69 = (size_t *)(ulong)CONCAT31((int3)(uVar74 >> 8),bVar67),
                                bVar67 == 0)) &&
                               ((bVar11 == false ||
                                ((fVar120 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 0xc
                                                      ), fVar120 == 1.0 && (!NAN(fVar120))))))) {
                              pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                              fVar120 = *pfVar2;
                              local_178 = pfVar2[1];
                              fVar100 = pfVar2[2];
                              fVar101 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                              fVar103 = *pfVar2;
                              fVar116 = pfVar2[1];
                              fVar119 = pfVar2[2];
                              fVar78 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                              fVar107 = *pfVar2;
                              fVar125 = pfVar2[1];
                              fVar91 = pfVar2[2];
                              fVar96 = pfVar2[3];
                              pfVar2 = (float *)(lVar14 + lVar73);
                              fVar97 = *pfVar2;
                              fVar113 = pfVar2[1];
                              fVar117 = pfVar2[2];
                              fVar104 = pfVar2[3];
                              local_158.quaternion = (bool)bVar60;
                              goto LAB_00164298;
                            }
                          }
                        }
                      }
                      uVar68 = uVar71 & 0xffffffff;
                      bVar67 = (byte)uVar68 | bVar11;
                      psVar69 = (size_t *)CONCAT71((int7)(uVar68 >> 8),bVar67);
                      if (bVar67 == 0) {
                        pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                        fVar117 = *pfVar2;
                        fVar127 = pfVar2[1];
                        fVar133 = pfVar2[2];
                        fVar136 = pfVar2[3];
                        pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                        fVar92 = *pfVar2;
                        fVar93 = pfVar2[1];
                        fVar94 = pfVar2[2];
                        fVar95 = pfVar2[3];
                        pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                        fVar98 = *pfVar2;
                        fVar99 = pfVar2[1];
                        fVar134 = pfVar2[2];
                        fVar102 = pfVar2[3];
                        fVar120 = fVar107 * fVar117 + fVar125 * fVar92 + fVar78 * fVar98;
                        local_178 = fVar107 * fVar127 + fVar125 * fVar93 + fVar78 * fVar99;
                        fVar100 = fVar107 * fVar133 + fVar125 * fVar94 + fVar78 * fVar134;
                        fVar101 = fVar107 * fVar136 + fVar125 * fVar95 + fVar78 * fVar102;
                        fVar78 = *(float *)((long)pAVar16 + lVar73 + -0x20);
                        fVar107 = *(float *)((long)pAVar16 + lVar73 + -0x1c);
                        fVar125 = *(float *)((long)pAVar16 + lVar73 + -0x18);
                        fVar96 = *(float *)((long)pAVar16 + lVar73 + -0x10);
                        fVar103 = fVar78 * fVar117 + fVar107 * fVar92 + fVar125 * fVar98;
                        fVar116 = fVar78 * fVar127 + fVar107 * fVar93 + fVar125 * fVar99;
                        fVar119 = fVar78 * fVar133 + fVar107 * fVar94 + fVar125 * fVar134;
                        fVar78 = fVar78 * fVar136 + fVar107 * fVar95 + fVar125 * fVar102;
                        fVar97 = *(float *)((long)pAVar16 + lVar73 + -0xc);
                        fVar113 = *(float *)((long)pAVar16 + lVar73 + -8);
                        fVar107 = fVar96 * fVar117 + fVar97 * fVar92 + fVar113 * fVar98;
                        fVar125 = fVar96 * fVar127 + fVar97 * fVar93 + fVar113 * fVar99;
                        fVar91 = fVar96 * fVar133 + fVar97 * fVar94 + fVar113 * fVar134;
                        fVar96 = fVar96 * fVar136 + fVar97 * fVar95 + fVar113 * fVar102;
                        fVar104 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                        fVar7 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 4);
                        fVar126 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 8);
                        pfVar2 = (float *)(lVar14 + lVar73);
                        fVar97 = fVar104 * fVar117 + fVar7 * fVar92 + fVar126 * fVar98 + *pfVar2;
                        fVar113 = fVar104 * fVar127 + fVar7 * fVar93 + fVar126 * fVar99 + pfVar2[1];
                        fVar117 = fVar104 * fVar133 + fVar7 * fVar94 + fVar126 * fVar134 + pfVar2[2]
                        ;
                        fVar104 = fVar104 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102 + pfVar2[3]
                        ;
                      }
                      else {
                        uVar71 = uVar71 & 0xffffffff;
                        bVar67 = (byte)uVar71 & bVar11;
                        psVar69 = (size_t *)CONCAT71((int7)(uVar71 >> 8),bVar67);
                        if (bVar67 == 1) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                     ,0x67);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          fVar78 = *(float *)(lVar14 + 0xc + lVar73);
                          fVar100 = *(float *)(lVar14 + -0x24 + lVar73);
                          fVar107 = *(float *)(lVar14 + -0x14 + lVar73);
                          fVar125 = *(float *)(lVar14 + -4 + lVar73);
                          auVar10 = *(undefined1 (*) [16])(lVar14 + -0x30 + lVar73);
                          pfVar3 = (float *)(lVar14 + -0x20 + lVar73);
                          fVar120 = *pfVar3;
                          fVar101 = pfVar3[1];
                          pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                          fVar103 = *pfVar2;
                          fVar116 = pfVar2[1];
                          fVar119 = pfVar2[2];
                          fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                          fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                          fVar97 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                   -fVar125 * fVar125;
                          fVar113 = fVar78 * fVar78 - fVar100 * fVar100;
                          fVar117 = fVar107 * fVar107 + fVar113 + -fVar125 * fVar125;
                          fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                          fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                          fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                          fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                          pfVar2 = (float *)(lVar14 + lVar73);
                          fVar104 = *pfVar2;
                          fVar7 = pfVar2[1];
                          fVar126 = pfVar2[2];
                          fVar127 = fVar127 + fVar127;
                          fVar136 = fVar136 + fVar136;
                          fVar96 = fVar96 + fVar96;
                          fVar133 = fVar133 + fVar133;
                          fVar91 = fVar91 + fVar91;
                          fVar78 = fVar78 + fVar78;
                          fVar100 = fVar125 * fVar125 + fVar113 + -fVar107 * fVar107;
                          fVar111 = fVar97 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                          fVar114 = fVar97 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                          fVar118 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                          fVar123 = fVar97 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                          fVar106 = fVar96 * 1.0 + fVar117 * 0.0 + fVar133 * 0.0;
                          fVar108 = fVar96 * 0.0 + fVar117 * 1.0 + fVar133 * 0.0;
                          fVar109 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 1.0;
                          fVar110 = fVar96 * 0.0 + fVar117 * 0.0 + fVar133 * 0.0;
                          fVar97 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                          fVar113 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                          fVar117 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                          fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                          local_168 = auVar10._4_4_;
                          fStack_164 = auVar10._8_4_;
                          local_178 = auVar10._0_4_;
                          fVar129 = local_178 * fVar111 + fVar106 * 0.0 + fVar97 * 0.0;
                          fVar130 = local_178 * fVar114 + fVar108 * 0.0 + fVar113 * 0.0;
                          fVar131 = local_178 * fVar118 + fVar109 * 0.0 + fVar117 * 0.0;
                          fVar132 = local_178 * fVar123 + fVar110 * 0.0 + fVar92 * 0.0;
                          fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar97 * 0.0;
                          fVar133 = fVar120 * fVar114 + fVar101 * fVar108 + fVar113 * 0.0;
                          fVar136 = fVar120 * fVar118 + fVar101 * fVar109 + fVar117 * 0.0;
                          fVar93 = fVar120 * fVar123 + fVar101 * fVar110 + fVar92 * 0.0;
                          local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar97;
                          fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar113;
                          fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar117;
                          fStack_11c = fVar103 * fVar123 + fVar116 * fVar110 + fVar119 * fVar92;
                          fVar78 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar73 + 0xc);
                          fVar100 = *(float *)((long)pAVar16 + lVar73 + -0x24);
                          fVar107 = *(float *)((long)pAVar16 + lVar73 + -0x14);
                          fVar125 = *(float *)((long)pAVar16 + lVar73 + -4);
                          fVar95 = fVar100 * fVar107 + fVar78 * fVar125;
                          fVar96 = fVar100 * fVar107 - fVar78 * fVar125;
                          fVar94 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                                   -fVar125 * fVar125;
                          fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                          fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                          fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                          fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                          fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                          fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                          pfVar4 = (float *)((long)pAVar16 + lVar73 + -0x30);
                          fVar78 = *pfVar4;
                          pfVar6 = (float *)((long)pAVar16 + lVar73 + -0x20);
                          fVar100 = *pfVar6;
                          fVar120 = pfVar6[1];
                          fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                          pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x10);
                          fVar107 = *pfVar2;
                          fVar125 = pfVar2[1];
                          fVar101 = pfVar2[2];
                          fVar95 = fVar95 + fVar95;
                          fVar134 = fVar134 + fVar134;
                          pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                          fVar103 = *pfVar2;
                          fVar116 = pfVar2[1];
                          fVar119 = pfVar2[2];
                          fVar98 = fVar94 * 1.0 + fVar95 * 0.0 + fVar134 * 0.0;
                          fVar99 = fVar94 * 0.0 + fVar95 * 1.0 + fVar134 * 0.0;
                          fVar134 = fVar94 * 0.0 + fVar95 * 0.0 + fVar134 * 1.0;
                          fVar96 = fVar96 + fVar96;
                          fVar137 = fVar137 + fVar137;
                          fVar102 = fVar102 + fVar102;
                          fVar91 = fVar91 + fVar91;
                          fVar94 = fVar96 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                          fVar95 = fVar96 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                          fVar96 = fVar96 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                          fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                          fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                          fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                          fVar112 = fVar78 * fVar98 + fVar94 * 0.0 + fVar135 * 0.0;
                          fVar115 = fVar78 * fVar99 + fVar95 * 0.0 + fVar137 * 0.0;
                          fVar121 = fVar78 * fVar134 + fVar96 * 0.0 + fVar91 * 0.0;
                          fVar102 = fVar100 * fVar98 + fVar120 * fVar94 + fVar135 * 0.0;
                          fVar122 = fVar100 * fVar99 + fVar120 * fVar95 + fVar137 * 0.0;
                          fVar105 = fVar100 * fVar134 + fVar120 * fVar96 + fVar91 * 0.0;
                          fVar124 = fVar107 * fVar98 + fVar125 * fVar94 + fVar101 * fVar135;
                          fVar128 = fVar107 * fVar99 + fVar125 * fVar95 + fVar101 * fVar137;
                          fVar101 = fVar107 * fVar134 + fVar125 * fVar96 + fVar101 * fVar91;
                          fVar94 = fVar103 * fVar98 + fVar116 * fVar94 + fVar119 * fVar135 +
                                   pfVar4[1] + 0.0;
                          fVar95 = fVar103 * fVar99 + fVar116 * fVar95 + fVar119 * fVar137 +
                                   pfVar4[2] + 0.0;
                          fVar103 = fVar103 * fVar134 + fVar116 * fVar96 + fVar119 * fVar91 +
                                    pfVar6[2] + 0.0;
                          fVar120 = fVar112 * fVar129 + fVar115 * fVar127 + fVar121 * local_128;
                          local_178 = fVar112 * fVar130 + fVar115 * fVar133 + fVar121 * fStack_124;
                          fVar100 = fVar112 * fVar131 + fVar115 * fVar136 + fVar121 * fStack_120;
                          fVar119 = fVar102 * fVar131 + fVar122 * fVar136 + fVar105 * fStack_120;
                          fVar78 = fVar102 * fVar132 + fVar122 * fVar93 + fVar105 * fStack_11c;
                          fVar107 = fVar124 * fVar129 + fVar128 * fVar127 + fVar101 * local_128;
                          fVar125 = fVar124 * fVar130 + fVar128 * fVar133 + fVar101 * fStack_124;
                          fVar91 = fVar124 * fVar131 + fVar128 * fVar136 + fVar101 * fStack_120;
                          psVar69 = extraout_RDX_21;
                          fVar96 = fVar124 * fVar132 + fVar128 * fVar93 + fVar101 * fStack_11c;
                          fVar101 = fVar112 * fVar132 + fVar115 * fVar93 + fVar121 * fStack_11c;
                          fVar97 = fVar94 * fVar129 + fVar95 * fVar127 + fVar103 * local_128 +
                                   fVar104 * fVar111 + fVar7 * fVar106 + fVar126 * fVar97 +
                                   local_168 + 0.0;
                          fVar113 = fVar94 * fVar130 + fVar95 * fVar133 + fVar103 * fStack_124 +
                                    fVar104 * fVar114 + fVar7 * fVar108 + fVar126 * fVar113 +
                                    fStack_164 + 0.0;
                          fVar117 = fVar94 * fVar131 + fVar95 * fVar136 + fVar103 * fStack_120 +
                                    fVar104 * fVar118 + fVar7 * fVar109 + fVar126 * fVar117 +
                                    pfVar3[2] + 0.0;
                          fVar104 = fVar94 * fVar132 + fVar95 * fVar93 + fVar103 * fStack_11c +
                                    fVar104 * fVar123 + fVar7 * fVar110 + fVar126 * fVar92 + 0.0;
                          fVar103 = fVar102 * fVar129 + fVar122 * fVar127 + fVar105 * local_128;
                          fVar116 = fVar102 * fVar130 + fVar122 * fVar133 + fVar105 * fStack_124;
                        }
                        else {
                          bVar60 = bVar60 ^ 1 | bVar11;
                          if (bVar60 == 0) {
                            local_c8 = ZEXT416(*(uint *)(lVar14 + 0xc + lVar73));
                            local_a8 = ZEXT416(*(uint *)(lVar14 + -0x24 + lVar73));
                            local_d8 = ZEXT416(*(uint *)(lVar14 + -4 + lVar73));
                            pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                            local_e8 = *pfVar2;
                            fStack_e4 = pfVar2[1];
                            fStack_dc = pfVar2[3];
                            pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                            local_f8 = *pfVar2;
                            fStack_f4 = pfVar2[1];
                            fStack_f0 = pfVar2[2];
                            fStack_ec = pfVar2[3];
                            local_b8 = *(undefined8 *)(lVar14 + -0x18 + lVar73);
                            uStack_b0 = 0;
                            pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                            local_88 = *pfVar2;
                            fStack_7c = pfVar2[1];
                            pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x30);
                            fVar78 = *pfVar2;
                            fVar107 = pfVar2[1];
                            fVar125 = pfVar2[2];
                            pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x20);
                            fVar101 = *pfVar2;
                            fVar103 = pfVar2[1];
                            fVar116 = pfVar2[2];
                            puVar5 = (undefined8 *)((long)pAVar16 + lVar73 + -0x10);
                            local_108 = *puVar5;
                            uStack_100 = puVar5[1];
                            pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                            fVar119 = *pfVar2;
                            fVar91 = pfVar2[1];
                            fVar96 = pfVar2[2];
                            fVar120 = fVar78 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                            fVar97 = fVar78 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                            fVar78 = fVar78 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                            local_128 = fVar101 * local_88 + fVar103 * local_e8 + fVar116 * local_f8
                            ;
                            fStack_124 = fVar101 * 0.0 + fVar103 * fStack_e4 + fVar116 * fStack_f4;
                            fStack_120 = fVar101 * 0.0 + fVar103 * 0.0 + fVar116 * fStack_f0;
                            fStack_11c = fVar101 * fStack_7c +
                                         fVar103 * fStack_dc + fVar116 * fStack_ec;
                            fStack_e0 = 0.0;
                            fStack_84 = 0.0;
                            fStack_80 = 0.0;
                            pfVar2 = (float *)(lVar14 + lVar73);
                            local_98 = fVar119 * local_88 + fVar91 * local_e8 + fVar96 * local_f8 +
                                       *pfVar2;
                            fStack_94 = fVar119 * 0.0 + fVar91 * fStack_e4 + fVar96 * fStack_f4 +
                                        pfVar2[1];
                            fStack_90 = fVar119 * 0.0 + fVar91 * 0.0 + fVar96 * fStack_f0 +
                                        pfVar2[2];
                            fStack_8c = fVar119 * fStack_7c +
                                        fVar91 * fStack_dc + fVar96 * fStack_ec + pfVar2[3];
                            if (((fVar97 != 0.0) || (NAN(fVar97))) ||
                               ((fVar78 != 0.0 ||
                                (((NAN(fVar78) || (fStack_120 != 0.0)) || (NAN(fStack_120))))))) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                         ,0x61);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                              std::ostream::put(-0x38);
                              std::ostream::flush();
                              psVar69 = extraout_RDX_23;
                            }
                            fVar107 = local_88 * (float)local_108 +
                                      local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                            fVar125 = fStack_84 * (float)local_108 +
                                      fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                            fVar91 = fStack_80 * (float)local_108 +
                                     fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                            local_158.quaternion = true;
                            fVar119 = (float)local_b8;
                            fVar78 = (float)((ulong)local_b8 >> 0x20);
                            fVar96 = (float)local_d8._0_4_;
                            fVar101 = (float)local_a8._0_4_;
                            fVar97 = local_98;
                            fVar113 = fStack_94;
                            fVar117 = fStack_90;
                            fVar104 = (float)local_c8._0_4_;
                            fVar103 = local_128;
                            fVar116 = fStack_124;
                          }
                          else {
                            if (((local_178 != 0.0) || (NAN(local_178))) ||
                               ((fVar100 != 0.0 ||
                                ((NAN(fVar100) ||
                                 (uVar8 = *(undefined8 *)(lVar14 + -0x10 + lVar73),
                                 auVar41._4_4_ = -(uint)(*(float *)(lVar14 + -0x20 + lVar73) != 0.0)
                                 , auVar41._0_4_ =
                                        -(uint)(*(float *)(lVar14 + -0x18 + lVar73) != 0.0),
                                 auVar41._8_4_ = -(uint)((float)uVar8 != 0.0),
                                 auVar41._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                                 uVar61 = movmskps((int)CONCAT71(uVar66,bVar60),auVar41),
                                 (char)uVar61 != '\0')))))) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                         ,0x83);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                              std::ostream::put(-0x38);
                              std::ostream::flush();
                              psVar69 = extraout_RDX_22;
                            }
                            pfVar3 = (float *)((long)pAVar16 + lVar73 + -0x30);
                            pfVar4 = (float *)((long)pAVar16 + lVar73 + -0x20);
                            fVar78 = pfVar4[3];
                            pfVar6 = (float *)((long)pAVar16 + lVar73 + -0x10);
                            fVar107 = *pfVar6;
                            fVar125 = pfVar6[1];
                            pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                            fVar120 = *(float *)(lVar14 + -0x30 + lVar73) * *pfVar3;
                            local_178 = pfVar3[1] + (float)*(undefined8 *)(lVar14 + lVar73);
                            fVar100 = pfVar3[2] +
                                      (float)((ulong)*(undefined8 *)(lVar14 + lVar73) >> 0x20);
                            fVar119 = pfVar4[2] + *(float *)(lVar14 + 8 + lVar73);
                            fVar91 = pfVar6[2] * *(float *)(lVar14 + -8 + lVar73);
                            local_158.quaternion = true;
                            fVar96 = pfVar6[3];
                            fVar101 = pfVar3[3];
                            fVar97 = *pfVar2;
                            fVar113 = pfVar2[1];
                            fVar117 = pfVar2[2];
                            fVar104 = pfVar2[3];
                            fVar103 = *pfVar4;
                            fVar116 = pfVar4[1] * *(float *)(lVar14 + -0x1c + lVar73);
                          }
                        }
                      }
                    }
                    else {
                      pfVar2 = (float *)(lVar14 + -0x24 + lVar73);
                      auVar38._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar38._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar38._8_4_ = -(uint)(pfVar2[2] != 1.0);
                      auVar38._12_4_ = -(uint)(pfVar2[3] != 0.0);
                      uVar74 = movmskps(uVar74,auVar38);
                      if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                         (((uVar74 & 4) != 0 ||
                          (bVar67 = ((byte)uVar74 & 8) >> 3,
                          uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))))
                      goto LAB_00163b39;
                      pfVar2 = (float *)(lVar14 + -0x14 + lVar73);
                      auVar39._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar39._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar39._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar39._12_4_ = -(uint)(pfVar2[3] != 1.0);
                      uVar74 = movmskps(uVar74,auVar39);
                      if (((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                          ((uVar74 & 4) != 0)) ||
                         (bVar67 = ((byte)uVar74 & 8) >> 3,
                         uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 != 0))
                      goto LAB_00163b39;
                      pfVar2 = (float *)(lVar14 + -4 + lVar73);
                      auVar40._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar40._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar40._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar40._12_4_ = -(uint)(pfVar2[3] != 0.0);
                      uVar74 = movmskps(uVar74,auVar40);
                      if ((((bVar60 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                         ((uVar74 & 4) != 0)) goto LAB_00163b39;
                      bVar67 = ((byte)uVar74 & 8) >> 3;
                      uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                      psVar69 = (size_t *)(ulong)uVar74;
                      if ((bVar67 != 0) ||
                         ((bVar60 != 0 &&
                          ((fVar78 = *(float *)(lVar14 + 0xc + lVar73), fVar78 != 1.0 ||
                           (NAN(fVar78))))))) goto LAB_00163b39;
                      pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x30);
                      fVar120 = *pfVar2;
                      local_178 = pfVar2[1];
                      fVar100 = pfVar2[2];
                      fVar101 = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x20);
                      fVar103 = *pfVar2;
                      fVar116 = pfVar2[1];
                      fVar119 = pfVar2[2];
                      fVar78 = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar16 + lVar73 + -0x10);
                      fVar107 = *pfVar2;
                      fVar125 = pfVar2[1];
                      fVar91 = pfVar2[2];
                      fVar96 = pfVar2[3];
                      pfVar2 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar73);
                      fVar97 = *pfVar2;
                      fVar113 = pfVar2[1];
                      fVar117 = pfVar2[2];
                      fVar104 = pfVar2[3];
                      local_158.quaternion = bVar11;
                    }
LAB_00164298:
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
                    *pfVar2 = fVar120;
                    pfVar2[1] = local_178;
                    pfVar2[2] = fVar100;
                    pfVar2[3] = fVar101;
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
                    *pfVar2 = fVar103;
                    pfVar2[1] = fVar116;
                    pfVar2[2] = fVar119;
                    pfVar2[3] = fVar78;
                    pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
                    *pfVar2 = fVar107;
                    pfVar2[1] = fVar125;
                    pfVar2[2] = fVar91;
                    pfVar2[3] = fVar96;
                    pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
                    *pfVar2 = fVar97;
                    pfVar2[1] = fVar113;
                    pfVar2[2] = fVar117;
                    pfVar2[3] = fVar104;
                    uVar70 = uVar70 + 1;
                    lVar73 = lVar73 + 0x40;
                    pAVar64 = local_158.spaces.items;
                  } while (uVar70 < *(ulong *)&(pLVar1->vy).field_0);
                }
              }
            }
            std::
            vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            ::emplace_back<embree::SceneGraph::Transformations>
                      ((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)local_58,&local_158);
            alignedFree(local_158.spaces.items);
            local_158.spaces.size_active = 0;
            local_158.spaces.size_alloced = 0;
            local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            p_Var72 = (_Base_ptr)((long)&local_38->_M_color + 1);
            pAVar64 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_68[0xd];
          } while (p_Var72 < (_Base_ptr)((local_68[0xe] - (long)pAVar64 >> 4) * -0x5555555555555555)
                  );
        }
        plVar63 = local_68;
        convertInstances(local_70,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_78,(Ref<embree::SceneGraph::Node> *)(local_68 + 0x10),
                         (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)local_58);
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::~vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   *)local_58);
      }
      plVar62 = local_110;
      if (plVar63 != (long *)0x0) {
        (**(code **)(*plVar63 + 0x18))(plVar63);
      }
    }
    else {
      (**(code **)(*plVar62 + 0x10))(plVar62);
      sVar13 = (spaces->spaces).size_active;
      if (sVar13 == 1) {
        fVar78 = (spaces->time_range).lower;
        fVar100 = (spaces->time_range).upper;
        fVar107 = (float)plVar62[0xd];
        fVar125 = (float)((ulong)plVar62[0xd] >> 0x20);
        uVar74 = -(uint)(fVar78 < fVar107);
        uVar76 = -(uint)(fVar100 < fVar125);
        sVar13 = plVar62[0xf];
        local_158.time_range.upper = (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76);
        local_158.time_range.lower = (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
        local_158.spaces.size_active = 0;
        local_158.spaces.size_alloced = 0;
        local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar70 = extraout_RDX;
        if (sVar13 != 0) {
          local_158.spaces.items =
               (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
               alignedMalloc(sVar13 << 6,0x10);
          uVar70 = extraout_RDX_00;
          local_158.spaces.size_alloced = sVar13;
        }
        local_158.quaternion = false;
        local_158.spaces.size_active = local_158.spaces.size_alloced;
        if (plVar62[0xf] != 0) {
          lVar73 = 0x30;
          uVar71 = 0;
          do {
            uVar74 = (uint)uVar70;
            pAVar64 = (spaces->spaces).items;
            lVar14 = plVar62[0x11];
            bVar11 = spaces->quaternion;
            bVar60 = *(byte *)(plVar62 + 0x12);
            local_158.quaternion = false;
            fVar78 = (pAVar64->l).vx.field_0.m128[0];
            uVar8 = *(undefined8 *)((long)&(pAVar64->l).vx.field_0 + 4);
            fVar100 = (float)((ulong)uVar8 >> 0x20);
            local_178 = (float)uVar8;
            if (((((fVar78 != 1.0) || (NAN(fVar78))) || (local_178 != 0.0)) ||
                ((NAN(local_178) || (fVar100 != 0.0)))) || (NAN(fVar100))) {
LAB_0015faa7:
              uVar8 = *(undefined8 *)(lVar14 + -0x30 + lVar73);
              fVar107 = (float)uVar8;
              fVar125 = (float)((ulong)uVar8 >> 0x20);
              iVar75 = -(uint)(fVar107 != 1.0);
              iVar77 = -(uint)(fVar125 != 0.0);
              auVar80._4_4_ = iVar77;
              auVar80._0_4_ = iVar75;
              auVar80._8_4_ = iVar77;
              auVar80._12_4_ = iVar77;
              auVar79._8_8_ = auVar80._8_8_;
              auVar79._4_4_ = iVar75;
              auVar79._0_4_ = iVar75;
              uVar74 = movmskpd(uVar74,auVar79);
              uVar70 = (ulong)uVar74;
              fVar78 = *(float *)(lVar14 + -0x28 + lVar73);
              if ((uVar74 & 1) == 0) {
                bVar67 = (byte)uVar74 >> 1;
                uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                uVar70 = (ulong)uVar74;
                if (((bVar67 == 0) && (fVar78 == 0.0)) && (!NAN(fVar78))) {
                  pfVar2 = (float *)(lVar14 + -0x24 + lVar73);
                  auVar42._4_4_ = -(uint)(pfVar2[1] != 0.0);
                  auVar42._0_4_ = -(uint)(*pfVar2 != 0.0);
                  auVar42._8_4_ = -(uint)(pfVar2[2] != 1.0);
                  auVar42._12_4_ = -(uint)(pfVar2[3] != 0.0);
                  uVar74 = movmskps(uVar74,auVar42);
                  uVar70 = (ulong)uVar74;
                  if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) && ((uVar74 & 4) == 0)
                     ) {
                    bVar67 = ((byte)uVar74 & 8) >> 3;
                    uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                    uVar70 = (ulong)uVar74;
                    if (bVar67 == 0) {
                      pfVar2 = (float *)(lVar14 + -0x14 + lVar73);
                      auVar43._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar43._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar43._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar43._12_4_ = -(uint)(pfVar2[3] != 1.0);
                      uVar74 = movmskps(uVar74,auVar43);
                      uVar70 = (ulong)uVar74;
                      if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                         ((uVar74 & 4) == 0)) {
                        bVar67 = ((byte)uVar74 & 8) >> 3;
                        uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                        uVar70 = (ulong)uVar74;
                        if (bVar67 == 0) {
                          pfVar2 = (float *)(lVar14 + -4 + lVar73);
                          auVar44._4_4_ = -(uint)(pfVar2[1] != 0.0);
                          auVar44._0_4_ = -(uint)(*pfVar2 != 0.0);
                          auVar44._8_4_ = -(uint)(pfVar2[2] != 0.0);
                          auVar44._12_4_ = -(uint)(pfVar2[3] != 0.0);
                          uVar74 = movmskps(uVar74,auVar44);
                          uVar70 = (ulong)uVar74;
                          if ((((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                               ((uVar74 & 4) == 0)) &&
                              (bVar67 = ((byte)uVar74 & 8) >> 3,
                              uVar70 = (ulong)CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 == 0)) &&
                             ((bVar60 == 0 ||
                              ((fVar120 = *(float *)(lVar14 + 0xc + lVar73), fVar120 == 1.0 &&
                               (!NAN(fVar120))))))) {
                            fVar97 = (pAVar64->l).vx.field_0.m128[0];
                            local_178 = (pAVar64->l).vx.field_0.m128[1];
                            fVar100 = (pAVar64->l).vx.field_0.m128[2];
                            fVar78 = (pAVar64->l).vx.field_0.m128[3];
                            fVar107 = (pAVar64->l).vy.field_0.m128[0];
                            fVar113 = (pAVar64->l).vy.field_0.m128[1];
                            fVar117 = (pAVar64->l).vy.field_0.m128[2];
                            fVar120 = (pAVar64->l).vy.field_0.m128[3];
                            fVar101 = (pAVar64->l).vz.field_0.m128[0];
                            fVar103 = (pAVar64->l).vz.field_0.m128[1];
                            fVar104 = (pAVar64->l).vz.field_0.m128[2];
                            fVar116 = (pAVar64->l).vz.field_0.m128[3];
                            fVar125 = (pAVar64->p).field_0.m128[0];
                            fVar119 = (pAVar64->p).field_0.m128[1];
                            fVar91 = (pAVar64->p).field_0.m128[2];
                            fVar96 = (pAVar64->p).field_0.m128[3];
                            local_158.quaternion = bVar11;
                            goto LAB_0016056b;
                          }
                        }
                      }
                    }
                  }
                }
              }
              if ((bVar11 == false) && (bVar60 == 0)) {
                fVar136 = (pAVar64->l).vx.field_0.m128[0];
                fVar92 = (pAVar64->l).vx.field_0.m128[1];
                fVar93 = (pAVar64->l).vx.field_0.m128[2];
                fVar94 = (pAVar64->l).vx.field_0.m128[3];
                fVar95 = (pAVar64->l).vy.field_0.m128[0];
                fVar98 = (pAVar64->l).vy.field_0.m128[1];
                fVar99 = (pAVar64->l).vy.field_0.m128[2];
                fVar134 = (pAVar64->l).vy.field_0.m128[3];
                fVar102 = (pAVar64->l).vz.field_0.m128[0];
                fVar135 = (pAVar64->l).vz.field_0.m128[1];
                fVar137 = (pAVar64->l).vz.field_0.m128[2];
                fVar122 = (pAVar64->l).vz.field_0.m128[3];
                fVar97 = fVar107 * fVar136 + fVar125 * fVar95 + fVar78 * fVar102;
                local_178 = fVar107 * fVar92 + fVar125 * fVar98 + fVar78 * fVar135;
                fVar100 = fVar107 * fVar93 + fVar125 * fVar99 + fVar78 * fVar137;
                fVar113 = *(float *)(lVar14 + -0x20 + lVar73);
                fVar7 = *(float *)(lVar14 + -0x1c + lVar73);
                fVar126 = *(float *)(lVar14 + -0x18 + lVar73);
                fVar116 = *(float *)(lVar14 + -0x10 + lVar73);
                fVar117 = fVar113 * fVar93 + fVar7 * fVar99 + fVar126 * fVar137;
                fVar120 = fVar113 * fVar94 + fVar7 * fVar134 + fVar126 * fVar122;
                fVar119 = *(float *)(lVar14 + -0xc + lVar73);
                fVar91 = *(float *)(lVar14 + -8 + lVar73);
                fVar101 = fVar116 * fVar136 + fVar119 * fVar95 + fVar91 * fVar102;
                fVar103 = fVar116 * fVar92 + fVar119 * fVar98 + fVar91 * fVar135;
                fVar104 = fVar116 * fVar93 + fVar119 * fVar99 + fVar91 * fVar137;
                fVar96 = *(float *)(lVar14 + lVar73);
                fVar127 = *(float *)(lVar14 + 4 + lVar73);
                fVar133 = *(float *)(lVar14 + 8 + lVar73);
                fVar116 = fVar116 * fVar94 + fVar119 * fVar134 + fVar91 * fVar122;
                fVar78 = fVar107 * fVar94 + fVar125 * fVar134 + fVar78 * fVar122;
                fVar125 = fVar96 * fVar136 + fVar127 * fVar95 + fVar133 * fVar102 +
                          (pAVar64->p).field_0.m128[0];
                fVar119 = fVar96 * fVar92 + fVar127 * fVar98 + fVar133 * fVar135 +
                          (pAVar64->p).field_0.m128[1];
                fVar91 = fVar96 * fVar93 + fVar127 * fVar99 + fVar133 * fVar137 +
                         (pAVar64->p).field_0.m128[2];
                fVar96 = fVar96 * fVar94 + fVar127 * fVar134 + fVar133 * fVar122 +
                         (pAVar64->p).field_0.m128[3];
                fVar107 = fVar113 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102;
                fVar113 = fVar113 * fVar92 + fVar7 * fVar98 + fVar126 * fVar135;
              }
              else if ((bVar11 == false) || (bVar60 == 0)) {
                if ((bVar11 == false) || (bVar60 != 0)) {
                  if ((local_178 != 0.0) ||
                     ((((NAN(local_178) || (fVar100 != 0.0)) || (NAN(fVar100))) ||
                      (uVar8 = *(undefined8 *)&(pAVar64->l).vz.field_0,
                      auVar22._4_4_ = -(uint)((pAVar64->l).vy.field_0.m128[0] != 0.0),
                      auVar22._0_4_ = -(uint)((pAVar64->l).vy.field_0.m128[2] != 0.0),
                      auVar22._8_4_ = -(uint)((float)uVar8 != 0.0),
                      auVar22._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                      uVar61 = movmskps((int)CONCAT71((int7)((ulong)plVar62 >> 8),bVar60),auVar22),
                      (char)uVar61 != '\0')))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_03;
                  }
                  pfVar3 = (float *)(lVar14 + -0x30 + lVar73);
                  fVar78 = pfVar3[3];
                  pfVar4 = (float *)(lVar14 + -0x20 + lVar73);
                  fVar107 = *pfVar4;
                  fVar120 = pfVar4[3];
                  pfVar6 = (float *)(lVar14 + -0x10 + lVar73);
                  fVar101 = *pfVar6;
                  fVar103 = pfVar6[1];
                  fVar116 = pfVar6[3];
                  pfVar2 = (float *)(lVar14 + lVar73);
                  fVar125 = *pfVar2;
                  fVar119 = pfVar2[1];
                  fVar91 = pfVar2[2];
                  fVar96 = pfVar2[3];
                  uVar8 = *(undefined8 *)&(pAVar64->p).field_0;
                  fVar97 = (pAVar64->l).vx.field_0.m128[0] * *pfVar3;
                  local_178 = pfVar3[1] + (float)uVar8;
                  fVar100 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                  fVar117 = pfVar4[2] + (pAVar64->p).field_0.m128[2];
                  fVar113 = pfVar4[1] * (pAVar64->l).vy.field_0.m128[1];
                  fVar104 = pfVar6[2] * (pAVar64->l).vz.field_0.m128[2];
                  local_158.quaternion = true;
                }
                else {
                  local_c8 = ZEXT416((uint)(pAVar64->p).field_0.m128[3]);
                  local_a8 = ZEXT416((uint)(pAVar64->l).vx.field_0.m128[3]);
                  local_d8 = ZEXT416((uint)(pAVar64->l).vz.field_0.m128[3]);
                  local_e8 = (pAVar64->l).vy.field_0.m128[0];
                  fStack_e4 = (pAVar64->l).vy.field_0.m128[1];
                  fStack_dc = (pAVar64->l).vy.field_0.m128[3];
                  local_f8 = (pAVar64->l).vz.field_0.m128[0];
                  fStack_f4 = (pAVar64->l).vz.field_0.m128[1];
                  fStack_f0 = (pAVar64->l).vz.field_0.m128[2];
                  fStack_ec = (pAVar64->l).vz.field_0.m128[3];
                  local_b8 = *(undefined8 *)((long)&(pAVar64->l).vy.field_0 + 8);
                  uStack_b0 = 0;
                  local_88 = (pAVar64->l).vx.field_0.m128[0];
                  fStack_7c = (pAVar64->l).vx.field_0.m128[1];
                  pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                  fVar78 = *pfVar2;
                  fVar107 = pfVar2[1];
                  fVar125 = pfVar2[2];
                  pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                  fVar120 = *pfVar2;
                  fVar101 = pfVar2[1];
                  fVar103 = pfVar2[2];
                  puVar5 = (undefined8 *)(lVar14 + -0x10 + lVar73);
                  local_108 = *puVar5;
                  uStack_100 = puVar5[1];
                  pfVar2 = (float *)(lVar14 + lVar73);
                  fVar116 = *pfVar2;
                  fVar119 = pfVar2[1];
                  fVar91 = pfVar2[2];
                  fVar97 = fVar78 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                  fVar96 = fVar78 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                  fVar78 = fVar78 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                  local_128 = fVar120 * local_88 + fVar101 * local_e8 + fVar103 * local_f8;
                  fStack_124 = fVar120 * 0.0 + fVar101 * fStack_e4 + fVar103 * fStack_f4;
                  fStack_120 = fVar120 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                  fStack_11c = fVar120 * fStack_7c + fVar101 * fStack_dc + fVar103 * fStack_ec;
                  fStack_e0 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  local_98 = fVar116 * local_88 + fVar119 * local_e8 + fVar91 * local_f8 +
                             (pAVar64->p).field_0.m128[0];
                  fStack_94 = fVar116 * 0.0 + fVar119 * fStack_e4 + fVar91 * fStack_f4 +
                              (pAVar64->p).field_0.m128[1];
                  fStack_90 = fVar116 * 0.0 + fVar119 * 0.0 + fVar91 * fStack_f0 +
                              (pAVar64->p).field_0.m128[2];
                  fStack_8c = fVar116 * fStack_7c + fVar119 * fStack_dc + fVar91 * fStack_ec +
                              (pAVar64->p).field_0.m128[3];
                  if ((((fVar96 != 0.0) || (NAN(fVar96))) ||
                      ((fVar78 != 0.0 || ((NAN(fVar78) || (fStack_120 != 0.0)))))) ||
                     (NAN(fStack_120))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_02;
                  }
                  fVar101 = local_88 * (float)local_108 +
                            local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                  fVar103 = fStack_84 * (float)local_108 +
                            fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                  fVar104 = fStack_80 * (float)local_108 +
                            fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                  local_158.quaternion = true;
                  fVar117 = (float)local_b8;
                  fVar120 = (float)((ulong)local_b8 >> 0x20);
                  fVar116 = (float)local_d8._0_4_;
                  fVar78 = (float)local_a8._0_4_;
                  fVar125 = local_98;
                  fVar119 = fStack_94;
                  fVar91 = fStack_90;
                  fVar96 = (float)local_c8._0_4_;
                  fVar107 = local_128;
                  fVar113 = fStack_124;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                std::ostream::put(-0x38);
                std::ostream::flush();
                fVar78 = (pAVar64->p).field_0.m128[3];
                fVar100 = (pAVar64->l).vx.field_0.m128[3];
                fVar107 = (pAVar64->l).vy.field_0.m128[3];
                fVar125 = (pAVar64->l).vz.field_0.m128[3];
                aVar9 = (pAVar64->l).vx.field_0.field_1;
                fVar120 = (pAVar64->l).vy.field_0.m128[0];
                fVar101 = (pAVar64->l).vy.field_0.m128[1];
                fVar103 = (pAVar64->l).vz.field_0.m128[0];
                fVar116 = (pAVar64->l).vz.field_0.m128[1];
                fVar119 = (pAVar64->l).vz.field_0.m128[2];
                fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar104 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar126 = fVar107 * fVar107 + fVar104 + -fVar125 * fVar125;
                fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                fVar96 = (pAVar64->p).field_0.m128[0];
                fVar113 = (pAVar64->p).field_0.m128[1];
                fVar7 = (pAVar64->p).field_0.m128[2];
                fVar127 = fVar127 + fVar127;
                fVar136 = fVar136 + fVar136;
                fVar97 = fVar97 + fVar97;
                fVar133 = fVar133 + fVar133;
                fVar91 = fVar91 + fVar91;
                fVar78 = fVar78 + fVar78;
                fVar100 = fVar125 * fVar125 + fVar104 + -fVar107 * fVar107;
                fVar111 = fVar117 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar114 = fVar117 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                fVar118 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                fVar121 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar106 = fVar97 * 1.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar108 = fVar97 * 0.0 + fVar126 * 1.0 + fVar133 * 0.0;
                fVar109 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 1.0;
                fVar110 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar126 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                fVar133 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                fVar94 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                local_168 = aVar9.y;
                fStack_164 = aVar9.z;
                local_178 = aVar9.x;
                fVar128 = local_178 * fVar111 + fVar106 * 0.0 + fVar126 * 0.0;
                fVar129 = local_178 * fVar114 + fVar108 * 0.0 + fVar133 * 0.0;
                fVar130 = local_178 * fVar118 + fVar109 * 0.0 + fVar92 * 0.0;
                fVar131 = local_178 * fVar121 + fVar110 * 0.0 + fVar94 * 0.0;
                fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar126 * 0.0;
                fVar136 = fVar120 * fVar114 + fVar101 * fVar108 + fVar133 * 0.0;
                fVar93 = fVar120 * fVar118 + fVar101 * fVar109 + fVar92 * 0.0;
                fVar95 = fVar120 * fVar121 + fVar101 * fVar110 + fVar94 * 0.0;
                local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar126;
                fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar133;
                fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar92;
                fStack_11c = fVar103 * fVar121 + fVar116 * fVar110 + fVar119 * fVar94;
                fVar78 = *(float *)(lVar14 + 0xc + lVar73);
                fVar100 = *(float *)(lVar14 + -0x24 + lVar73);
                fVar107 = *(float *)(lVar14 + -0x14 + lVar73);
                fVar125 = *(float *)(lVar14 + -4 + lVar73);
                fVar104 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                pfVar3 = (float *)(lVar14 + -0x30 + lVar73);
                fVar78 = *pfVar3;
                pfVar4 = (float *)(lVar14 + -0x20 + lVar73);
                fVar100 = *pfVar4;
                fVar120 = pfVar4[1];
                fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                fVar107 = *pfVar2;
                fVar125 = pfVar2[1];
                fVar101 = pfVar2[2];
                fVar104 = fVar104 + fVar104;
                fVar134 = fVar134 + fVar134;
                pfVar2 = (float *)(lVar14 + lVar73);
                fVar103 = *pfVar2;
                fVar116 = pfVar2[1];
                fVar119 = pfVar2[2];
                fVar98 = fVar117 * 1.0 + fVar104 * 0.0 + fVar134 * 0.0;
                fVar99 = fVar117 * 0.0 + fVar104 * 1.0 + fVar134 * 0.0;
                fVar134 = fVar117 * 0.0 + fVar104 * 0.0 + fVar134 * 1.0;
                fVar97 = fVar97 + fVar97;
                fVar137 = fVar137 + fVar137;
                fVar102 = fVar102 + fVar102;
                fVar91 = fVar91 + fVar91;
                fVar117 = fVar97 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                fVar104 = fVar97 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                fVar97 = fVar97 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                fVar112 = fVar78 * fVar98 + fVar117 * 0.0 + fVar135 * 0.0;
                fVar115 = fVar78 * fVar99 + fVar104 * 0.0 + fVar137 * 0.0;
                fVar78 = fVar78 * fVar134 + fVar97 * 0.0 + fVar91 * 0.0;
                fVar102 = fVar100 * fVar98 + fVar120 * fVar117 + fVar135 * 0.0;
                fVar122 = fVar100 * fVar99 + fVar120 * fVar104 + fVar137 * 0.0;
                fVar105 = fVar100 * fVar134 + fVar120 * fVar97 + fVar91 * 0.0;
                fVar123 = fVar107 * fVar98 + fVar125 * fVar117 + fVar101 * fVar135;
                fVar124 = fVar107 * fVar99 + fVar125 * fVar104 + fVar101 * fVar137;
                fVar125 = fVar107 * fVar134 + fVar125 * fVar97 + fVar101 * fVar91;
                fVar107 = fVar103 * fVar98 + fVar116 * fVar117 + fVar119 * fVar135 + pfVar3[1] + 0.0
                ;
                fVar98 = fVar103 * fVar99 + fVar116 * fVar104 + fVar119 * fVar137 + pfVar3[2] + 0.0;
                fVar99 = fVar103 * fVar134 + fVar116 * fVar97 + fVar119 * fVar91 + pfVar4[2] + 0.0;
                fVar97 = fVar112 * fVar128 + fVar115 * fVar127 + fVar78 * local_128;
                local_178 = fVar112 * fVar129 + fVar115 * fVar136 + fVar78 * fStack_124;
                fVar100 = fVar112 * fVar130 + fVar115 * fVar93 + fVar78 * fStack_120;
                fVar117 = fVar102 * fVar130 + fVar122 * fVar93 + fVar105 * fStack_120;
                fVar120 = fVar102 * fVar131 + fVar122 * fVar95 + fVar105 * fStack_11c;
                fVar101 = fVar123 * fVar128 + fVar124 * fVar127 + fVar125 * local_128;
                fVar103 = fVar123 * fVar129 + fVar124 * fVar136 + fVar125 * fStack_124;
                fVar104 = fVar123 * fVar130 + fVar124 * fVar93 + fVar125 * fStack_120;
                uVar70 = extraout_RDX_01;
                fVar116 = fVar123 * fVar131 + fVar124 * fVar95 + fVar125 * fStack_11c;
                fVar78 = fVar112 * fVar131 + fVar115 * fVar95 + fVar78 * fStack_11c;
                fVar125 = fVar107 * fVar128 + fVar98 * fVar127 + fVar99 * local_128 +
                          fVar96 * fVar111 + fVar113 * fVar106 + fVar7 * fVar126 + local_168 + 0.0;
                fVar119 = fVar107 * fVar129 + fVar98 * fVar136 + fVar99 * fStack_124 +
                          fVar96 * fVar114 + fVar113 * fVar108 + fVar7 * fVar133 + fStack_164 + 0.0;
                fVar91 = fVar107 * fVar130 + fVar98 * fVar93 + fVar99 * fStack_120 +
                         fVar96 * fVar118 + fVar113 * fVar109 + fVar7 * fVar92 +
                         (pAVar64->l).vy.field_0.m128[2] + 0.0;
                fVar96 = fVar107 * fVar131 + fVar98 * fVar95 + fVar99 * fStack_11c +
                         fVar96 * fVar121 + fVar113 * fVar110 + fVar7 * fVar94 + 0.0;
                fVar107 = fVar102 * fVar128 + fVar122 * fVar127 + fVar105 * local_128;
                fVar113 = fVar102 * fVar129 + fVar122 * fVar136 + fVar105 * fStack_124;
              }
            }
            else {
              auVar19._4_4_ = -(uint)((pAVar64->l).vy.field_0.m128[0] != 0.0);
              auVar19._0_4_ = -(uint)((pAVar64->l).vx.field_0.m128[3] != 0.0);
              auVar19._8_4_ = -(uint)((pAVar64->l).vy.field_0.m128[1] != 1.0);
              auVar19._12_4_ = -(uint)((pAVar64->l).vy.field_0.m128[2] != 0.0);
              uVar74 = movmskps(uVar74,auVar19);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                 (((uVar74 & 4) != 0 ||
                  (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_0015faa7;
              auVar20._4_4_ = -(uint)((pAVar64->l).vz.field_0.m128[0] != 0.0);
              auVar20._0_4_ = -(uint)((pAVar64->l).vy.field_0.m128[3] != 0.0);
              auVar20._8_4_ = -(uint)((pAVar64->l).vz.field_0.m128[1] != 0.0);
              auVar20._12_4_ = -(uint)((pAVar64->l).vz.field_0.m128[2] != 1.0);
              uVar74 = movmskps(uVar74,auVar20);
              if (((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
                 || (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_0015faa7;
              auVar21._4_4_ = -(uint)((pAVar64->p).field_0.m128[0] != 0.0);
              auVar21._0_4_ = -(uint)((pAVar64->l).vz.field_0.m128[3] != 0.0);
              auVar21._8_4_ = -(uint)((pAVar64->p).field_0.m128[1] != 0.0);
              auVar21._12_4_ = -(uint)((pAVar64->p).field_0.m128[2] != 0.0);
              uVar74 = movmskps(uVar74,auVar21);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
              goto LAB_0015faa7;
              bVar67 = ((byte)uVar74 & 8) >> 3;
              uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
              uVar70 = (ulong)uVar74;
              if ((bVar67 != 0) ||
                 ((bVar11 != false &&
                  ((fVar78 = (pAVar64->p).field_0.m128[3], fVar78 != 1.0 || (NAN(fVar78)))))))
              goto LAB_0015faa7;
              pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
              fVar97 = *pfVar2;
              local_178 = pfVar2[1];
              fVar100 = pfVar2[2];
              fVar78 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
              fVar107 = *pfVar2;
              fVar113 = pfVar2[1];
              fVar117 = pfVar2[2];
              fVar120 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
              fVar101 = *pfVar2;
              fVar103 = pfVar2[1];
              fVar104 = pfVar2[2];
              fVar116 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + lVar73);
              fVar125 = *pfVar2;
              fVar119 = pfVar2[1];
              fVar91 = pfVar2[2];
              fVar96 = pfVar2[3];
              local_158.quaternion = (bool)bVar60;
            }
LAB_0016056b:
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
            *pfVar2 = fVar97;
            pfVar2[1] = local_178;
            pfVar2[2] = fVar100;
            pfVar2[3] = fVar78;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
            *pfVar2 = fVar107;
            pfVar2[1] = fVar113;
            pfVar2[2] = fVar117;
            pfVar2[3] = fVar120;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
            *pfVar2 = fVar101;
            pfVar2[1] = fVar103;
            pfVar2[2] = fVar104;
            pfVar2[3] = fVar116;
            pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
            *pfVar2 = fVar125;
            pfVar2[1] = fVar119;
            pfVar2[2] = fVar91;
            pfVar2[3] = fVar96;
            uVar71 = uVar71 + 1;
            lVar73 = lVar73 + 0x40;
            plVar62 = local_110;
          } while (uVar71 < (ulong)local_110[0xf]);
        }
      }
      else if (plVar62[0xf] == 1) {
        fVar78 = (spaces->time_range).lower;
        fVar100 = (spaces->time_range).upper;
        fVar107 = (float)plVar62[0xd];
        fVar125 = (float)((ulong)plVar62[0xd] >> 0x20);
        uVar74 = -(uint)(fVar78 < fVar107);
        uVar76 = -(uint)(fVar100 < fVar125);
        local_158.time_range.upper = (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76);
        local_158.time_range.lower = (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
        local_158.spaces.size_active = 0;
        local_158.spaces.size_alloced = 0;
        local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar70 = extraout_RDX;
        if (sVar13 != 0) {
          local_158.spaces.items =
               (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
               alignedMalloc(sVar13 << 6,0x10);
          uVar70 = extraout_RDX_04;
          local_158.spaces.size_alloced = sVar13;
        }
        local_158.quaternion = true;
        if (spaces->quaternion == false) {
          local_158.quaternion = SUB41((int)plVar62[0x12],0);
        }
        local_158.spaces.size_active = local_158.spaces.size_alloced;
        if ((spaces->spaces).size_active != 0) {
          lVar73 = 0x30;
          uVar71 = 0;
          do {
            uVar74 = (uint)uVar70;
            pAVar64 = (spaces->spaces).items;
            pfVar2 = (float *)plVar62[0x11];
            bVar11 = spaces->quaternion;
            bVar60 = *(byte *)(plVar62 + 0x12);
            local_158.quaternion = false;
            fVar78 = *(float *)((long)pAVar64 + lVar73 + -0x30);
            uVar8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x2c);
            fVar100 = (float)((ulong)uVar8 >> 0x20);
            local_178 = (float)uVar8;
            if (((((fVar78 != 1.0) || (NAN(fVar78))) || (local_178 != 0.0)) ||
                ((NAN(local_178) || (fVar100 != 0.0)))) || (NAN(fVar100))) {
LAB_001607b5:
              fVar107 = (float)*(undefined8 *)pfVar2;
              fVar125 = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20);
              iVar75 = -(uint)(fVar107 != 1.0);
              iVar77 = -(uint)(fVar125 != 0.0);
              auVar82._4_4_ = iVar77;
              auVar82._0_4_ = iVar75;
              auVar82._8_4_ = iVar77;
              auVar82._12_4_ = iVar77;
              auVar81._8_8_ = auVar82._8_8_;
              auVar81._4_4_ = iVar75;
              auVar81._0_4_ = iVar75;
              uVar74 = movmskpd(uVar74,auVar81);
              uVar70 = (ulong)uVar74;
              fVar78 = pfVar2[2];
              if ((uVar74 & 1) == 0) {
                bVar67 = (byte)uVar74 >> 1;
                uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                uVar70 = (ulong)uVar74;
                if (((bVar67 == 0) && (fVar78 == 0.0)) && (!NAN(fVar78))) {
                  auVar45._4_4_ = -(uint)(pfVar2[4] != 0.0);
                  auVar45._0_4_ = -(uint)(pfVar2[3] != 0.0);
                  auVar45._8_4_ = -(uint)(pfVar2[5] != 1.0);
                  auVar45._12_4_ = -(uint)(pfVar2[6] != 0.0);
                  uVar74 = movmskps(uVar74,auVar45);
                  uVar70 = (ulong)uVar74;
                  if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) && ((uVar74 & 4) == 0)
                     ) {
                    bVar67 = ((byte)uVar74 & 8) >> 3;
                    uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                    uVar70 = (ulong)uVar74;
                    if (bVar67 == 0) {
                      auVar46._4_4_ = -(uint)(pfVar2[8] != 0.0);
                      auVar46._0_4_ = -(uint)(pfVar2[7] != 0.0);
                      auVar46._8_4_ = -(uint)(pfVar2[9] != 0.0);
                      auVar46._12_4_ = -(uint)(pfVar2[10] != 1.0);
                      uVar74 = movmskps(uVar74,auVar46);
                      uVar70 = (ulong)uVar74;
                      if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                         ((uVar74 & 4) == 0)) {
                        bVar67 = ((byte)uVar74 & 8) >> 3;
                        uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                        uVar70 = (ulong)uVar74;
                        if (bVar67 == 0) {
                          auVar47._4_4_ = -(uint)(pfVar2[0xc] != 0.0);
                          auVar47._0_4_ = -(uint)(pfVar2[0xb] != 0.0);
                          auVar47._8_4_ = -(uint)(pfVar2[0xd] != 0.0);
                          auVar47._12_4_ = -(uint)(pfVar2[0xe] != 0.0);
                          uVar74 = movmskps(uVar74,auVar47);
                          uVar70 = (ulong)uVar74;
                          if (((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                              ((uVar74 & 4) == 0)) &&
                             ((bVar67 = ((byte)uVar74 & 8) >> 3,
                              uVar70 = (ulong)CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 == 0 &&
                              ((bVar60 == 0 || ((pfVar2[0xf] == 1.0 && (!NAN(pfVar2[0xf]))))))))) {
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x30);
                            fVar97 = *pfVar2;
                            local_178 = pfVar2[1];
                            fVar100 = pfVar2[2];
                            fVar78 = pfVar2[3];
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x20);
                            fVar107 = *pfVar2;
                            fVar113 = pfVar2[1];
                            fVar117 = pfVar2[2];
                            fVar120 = pfVar2[3];
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x10);
                            fVar101 = *pfVar2;
                            fVar103 = pfVar2[1];
                            fVar104 = pfVar2[2];
                            fVar116 = pfVar2[3];
                            pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                            fVar125 = *pfVar2;
                            fVar119 = pfVar2[1];
                            fVar91 = pfVar2[2];
                            fVar96 = pfVar2[3];
                            local_158.quaternion = bVar11;
                            goto LAB_0016123b;
                          }
                        }
                      }
                    }
                  }
                }
              }
              if ((bVar11 == false) && (bVar60 == 0)) {
                pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x30);
                fVar136 = *pfVar3;
                fVar92 = pfVar3[1];
                fVar93 = pfVar3[2];
                fVar94 = pfVar3[3];
                pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x20);
                fVar95 = *pfVar3;
                fVar98 = pfVar3[1];
                fVar99 = pfVar3[2];
                fVar134 = pfVar3[3];
                pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x10);
                fVar102 = *pfVar3;
                fVar135 = pfVar3[1];
                fVar137 = pfVar3[2];
                fVar122 = pfVar3[3];
                fVar97 = fVar107 * fVar136 + fVar125 * fVar95 + fVar78 * fVar102;
                local_178 = fVar107 * fVar92 + fVar125 * fVar98 + fVar78 * fVar135;
                fVar100 = fVar107 * fVar93 + fVar125 * fVar99 + fVar78 * fVar137;
                fVar113 = pfVar2[4];
                fVar7 = pfVar2[5];
                fVar126 = pfVar2[6];
                fVar116 = pfVar2[8];
                fVar117 = fVar113 * fVar93 + fVar7 * fVar99 + fVar126 * fVar137;
                fVar120 = fVar113 * fVar94 + fVar7 * fVar134 + fVar126 * fVar122;
                fVar119 = pfVar2[9];
                fVar91 = pfVar2[10];
                fVar101 = fVar116 * fVar136 + fVar119 * fVar95 + fVar91 * fVar102;
                fVar103 = fVar116 * fVar92 + fVar119 * fVar98 + fVar91 * fVar135;
                fVar104 = fVar116 * fVar93 + fVar119 * fVar99 + fVar91 * fVar137;
                fVar96 = pfVar2[0xc];
                fVar127 = pfVar2[0xd];
                fVar133 = pfVar2[0xe];
                pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                fVar116 = fVar116 * fVar94 + fVar119 * fVar134 + fVar91 * fVar122;
                fVar78 = fVar107 * fVar94 + fVar125 * fVar134 + fVar78 * fVar122;
                fVar125 = fVar96 * fVar136 + fVar127 * fVar95 + fVar133 * fVar102 + *pfVar2;
                fVar119 = fVar96 * fVar92 + fVar127 * fVar98 + fVar133 * fVar135 + pfVar2[1];
                fVar91 = fVar96 * fVar93 + fVar127 * fVar99 + fVar133 * fVar137 + pfVar2[2];
                fVar96 = fVar96 * fVar94 + fVar127 * fVar134 + fVar133 * fVar122 + pfVar2[3];
                fVar107 = fVar113 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102;
                fVar113 = fVar113 * fVar92 + fVar7 * fVar98 + fVar126 * fVar135;
              }
              else if ((bVar11 == false) || (bVar60 == 0)) {
                if ((bVar11 == false) || (bVar60 != 0)) {
                  if ((local_178 != 0.0) ||
                     ((((NAN(local_178) || (fVar100 != 0.0)) || (NAN(fVar100))) ||
                      (uVar8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x10),
                      auVar26._4_4_ = -(uint)(*(float *)((long)pAVar64 + lVar73 + -0x20) != 0.0),
                      auVar26._0_4_ = -(uint)(*(float *)((long)pAVar64 + lVar73 + -0x18) != 0.0),
                      auVar26._8_4_ = -(uint)((float)uVar8 != 0.0),
                      auVar26._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                      uVar61 = movmskps((int)CONCAT71((int7)((ulong)plVar62 >> 8),bVar60),auVar26),
                      (char)uVar61 != '\0')))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_07;
                  }
                  fVar78 = pfVar2[3];
                  fVar107 = pfVar2[4];
                  fVar120 = pfVar2[7];
                  fVar101 = pfVar2[8];
                  fVar103 = pfVar2[9];
                  fVar116 = pfVar2[0xb];
                  fVar125 = pfVar2[0xc];
                  fVar119 = pfVar2[0xd];
                  fVar91 = pfVar2[0xe];
                  fVar96 = pfVar2[0xf];
                  uVar8 = *(undefined8 *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                  fVar97 = *(float *)((long)pAVar64 + lVar73 + -0x30) * *pfVar2;
                  local_178 = pfVar2[1] + (float)uVar8;
                  fVar100 = pfVar2[2] + (float)((ulong)uVar8 >> 0x20);
                  fVar117 = pfVar2[6] + *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 8);
                  fVar113 = pfVar2[5] * *(float *)((long)pAVar64 + lVar73 + -0x1c);
                  fVar104 = pfVar2[10] * *(float *)((long)pAVar64 + lVar73 + -8);
                  local_158.quaternion = true;
                }
                else {
                  local_c8 = ZEXT416(*(uint *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc));
                  local_a8 = ZEXT416(*(uint *)((long)pAVar64 + lVar73 + -0x24));
                  local_d8 = ZEXT416(*(uint *)((long)pAVar64 + lVar73 + -4));
                  pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x20);
                  local_e8 = *pfVar3;
                  fStack_e4 = pfVar3[1];
                  fStack_dc = pfVar3[3];
                  pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x10);
                  local_f8 = *pfVar3;
                  fStack_f4 = pfVar3[1];
                  fStack_f0 = pfVar3[2];
                  fStack_ec = pfVar3[3];
                  local_b8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x18);
                  uStack_b0 = 0;
                  pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x30);
                  local_88 = *pfVar3;
                  fStack_7c = pfVar3[1];
                  fVar78 = *pfVar2;
                  fVar107 = pfVar2[1];
                  fVar125 = pfVar2[2];
                  fVar120 = pfVar2[4];
                  fVar101 = pfVar2[5];
                  fVar103 = pfVar2[6];
                  local_108 = *(undefined8 *)(pfVar2 + 8);
                  uStack_100 = *(undefined8 *)(pfVar2 + 10);
                  fVar116 = pfVar2[0xc];
                  fVar119 = pfVar2[0xd];
                  fVar91 = pfVar2[0xe];
                  fVar97 = fVar78 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                  fVar96 = fVar78 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                  fVar78 = fVar78 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                  local_128 = fVar120 * local_88 + fVar101 * local_e8 + fVar103 * local_f8;
                  fStack_124 = fVar120 * 0.0 + fVar101 * fStack_e4 + fVar103 * fStack_f4;
                  fStack_120 = fVar120 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                  fStack_11c = fVar120 * fStack_7c + fVar101 * fStack_dc + fVar103 * fStack_ec;
                  fStack_e0 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                  local_98 = fVar116 * local_88 + fVar119 * local_e8 + fVar91 * local_f8 + *pfVar2;
                  fStack_94 = fVar116 * 0.0 + fVar119 * fStack_e4 + fVar91 * fStack_f4 + pfVar2[1];
                  fStack_90 = fVar116 * 0.0 + fVar119 * 0.0 + fVar91 * fStack_f0 + pfVar2[2];
                  fStack_8c = fVar116 * fStack_7c + fVar119 * fStack_dc + fVar91 * fStack_ec +
                              pfVar2[3];
                  if ((((fVar96 != 0.0) || (NAN(fVar96))) ||
                      ((fVar78 != 0.0 || ((NAN(fVar78) || (fStack_120 != 0.0)))))) ||
                     (NAN(fStack_120))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_06;
                  }
                  fVar101 = local_88 * (float)local_108 +
                            local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                  fVar103 = fStack_84 * (float)local_108 +
                            fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                  fVar104 = fStack_80 * (float)local_108 +
                            fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                  local_158.quaternion = true;
                  fVar117 = (float)local_b8;
                  fVar120 = (float)((ulong)local_b8 >> 0x20);
                  fVar116 = (float)local_d8._0_4_;
                  fVar78 = (float)local_a8._0_4_;
                  fVar125 = local_98;
                  fVar119 = fStack_94;
                  fVar91 = fStack_90;
                  fVar96 = (float)local_c8._0_4_;
                  fVar107 = local_128;
                  fVar113 = fStack_124;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                std::ostream::put(-0x38);
                std::ostream::flush();
                fVar78 = *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc);
                fVar100 = *(float *)((long)pAVar64 + lVar73 + -0x24);
                fVar107 = *(float *)((long)pAVar64 + lVar73 + -0x14);
                fVar125 = *(float *)((long)pAVar64 + lVar73 + -4);
                auVar10 = *(undefined1 (*) [16])((long)pAVar64 + lVar73 + -0x30);
                pfVar4 = (float *)((long)pAVar64 + lVar73 + -0x20);
                fVar120 = *pfVar4;
                fVar101 = pfVar4[1];
                pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x10);
                fVar103 = *pfVar3;
                fVar116 = pfVar3[1];
                fVar119 = pfVar3[2];
                fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar104 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar126 = fVar107 * fVar107 + fVar104 + -fVar125 * fVar125;
                fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                pfVar3 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                fVar96 = *pfVar3;
                fVar113 = pfVar3[1];
                fVar7 = pfVar3[2];
                fVar127 = fVar127 + fVar127;
                fVar136 = fVar136 + fVar136;
                fVar97 = fVar97 + fVar97;
                fVar133 = fVar133 + fVar133;
                fVar91 = fVar91 + fVar91;
                fVar78 = fVar78 + fVar78;
                fVar100 = fVar125 * fVar125 + fVar104 + -fVar107 * fVar107;
                fVar111 = fVar117 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar114 = fVar117 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                fVar118 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                fVar121 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar106 = fVar97 * 1.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar108 = fVar97 * 0.0 + fVar126 * 1.0 + fVar133 * 0.0;
                fVar109 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 1.0;
                fVar110 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar126 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                fVar133 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                fVar94 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                local_168 = auVar10._4_4_;
                fStack_164 = auVar10._8_4_;
                local_178 = auVar10._0_4_;
                fVar128 = local_178 * fVar111 + fVar106 * 0.0 + fVar126 * 0.0;
                fVar129 = local_178 * fVar114 + fVar108 * 0.0 + fVar133 * 0.0;
                fVar130 = local_178 * fVar118 + fVar109 * 0.0 + fVar92 * 0.0;
                fVar131 = local_178 * fVar121 + fVar110 * 0.0 + fVar94 * 0.0;
                fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar126 * 0.0;
                fVar136 = fVar120 * fVar114 + fVar101 * fVar108 + fVar133 * 0.0;
                fVar93 = fVar120 * fVar118 + fVar101 * fVar109 + fVar92 * 0.0;
                fVar95 = fVar120 * fVar121 + fVar101 * fVar110 + fVar94 * 0.0;
                local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar126;
                fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar133;
                fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar92;
                fStack_11c = fVar103 * fVar121 + fVar116 * fVar110 + fVar119 * fVar94;
                fVar78 = pfVar2[0xf];
                fVar100 = pfVar2[3];
                fVar107 = pfVar2[7];
                fVar125 = pfVar2[0xb];
                fVar104 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                fVar78 = *pfVar2;
                fVar100 = pfVar2[4];
                fVar120 = pfVar2[5];
                fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                fVar107 = pfVar2[8];
                fVar125 = pfVar2[9];
                fVar101 = pfVar2[10];
                fVar104 = fVar104 + fVar104;
                fVar134 = fVar134 + fVar134;
                fVar103 = pfVar2[0xc];
                fVar116 = pfVar2[0xd];
                fVar119 = pfVar2[0xe];
                fVar98 = fVar117 * 1.0 + fVar104 * 0.0 + fVar134 * 0.0;
                fVar99 = fVar117 * 0.0 + fVar104 * 1.0 + fVar134 * 0.0;
                fVar134 = fVar117 * 0.0 + fVar104 * 0.0 + fVar134 * 1.0;
                fVar97 = fVar97 + fVar97;
                fVar137 = fVar137 + fVar137;
                fVar102 = fVar102 + fVar102;
                fVar91 = fVar91 + fVar91;
                fVar117 = fVar97 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                fVar104 = fVar97 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                fVar97 = fVar97 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                fVar112 = fVar78 * fVar98 + fVar117 * 0.0 + fVar135 * 0.0;
                fVar115 = fVar78 * fVar99 + fVar104 * 0.0 + fVar137 * 0.0;
                fVar78 = fVar78 * fVar134 + fVar97 * 0.0 + fVar91 * 0.0;
                fVar102 = fVar100 * fVar98 + fVar120 * fVar117 + fVar135 * 0.0;
                fVar122 = fVar100 * fVar99 + fVar120 * fVar104 + fVar137 * 0.0;
                fVar105 = fVar100 * fVar134 + fVar120 * fVar97 + fVar91 * 0.0;
                fVar123 = fVar107 * fVar98 + fVar125 * fVar117 + fVar101 * fVar135;
                fVar124 = fVar107 * fVar99 + fVar125 * fVar104 + fVar101 * fVar137;
                fVar125 = fVar107 * fVar134 + fVar125 * fVar97 + fVar101 * fVar91;
                fVar107 = fVar103 * fVar98 + fVar116 * fVar117 + fVar119 * fVar135 + pfVar2[1] + 0.0
                ;
                fVar98 = fVar103 * fVar99 + fVar116 * fVar104 + fVar119 * fVar137 + pfVar2[2] + 0.0;
                fVar99 = fVar103 * fVar134 + fVar116 * fVar97 + fVar119 * fVar91 + pfVar2[6] + 0.0;
                fVar97 = fVar112 * fVar128 + fVar115 * fVar127 + fVar78 * local_128;
                local_178 = fVar112 * fVar129 + fVar115 * fVar136 + fVar78 * fStack_124;
                fVar100 = fVar112 * fVar130 + fVar115 * fVar93 + fVar78 * fStack_120;
                fVar117 = fVar102 * fVar130 + fVar122 * fVar93 + fVar105 * fStack_120;
                fVar120 = fVar102 * fVar131 + fVar122 * fVar95 + fVar105 * fStack_11c;
                fVar101 = fVar123 * fVar128 + fVar124 * fVar127 + fVar125 * local_128;
                fVar103 = fVar123 * fVar129 + fVar124 * fVar136 + fVar125 * fStack_124;
                fVar104 = fVar123 * fVar130 + fVar124 * fVar93 + fVar125 * fStack_120;
                uVar70 = extraout_RDX_05;
                fVar116 = fVar123 * fVar131 + fVar124 * fVar95 + fVar125 * fStack_11c;
                fVar78 = fVar112 * fVar131 + fVar115 * fVar95 + fVar78 * fStack_11c;
                fVar125 = fVar107 * fVar128 + fVar98 * fVar127 + fVar99 * local_128 +
                          fVar96 * fVar111 + fVar113 * fVar106 + fVar7 * fVar126 + local_168 + 0.0;
                fVar119 = fVar107 * fVar129 + fVar98 * fVar136 + fVar99 * fStack_124 +
                          fVar96 * fVar114 + fVar113 * fVar108 + fVar7 * fVar133 + fStack_164 + 0.0;
                fVar91 = fVar107 * fVar130 + fVar98 * fVar93 + fVar99 * fStack_120 +
                         fVar96 * fVar118 + fVar113 * fVar109 + fVar7 * fVar92 + pfVar4[2] + 0.0;
                fVar96 = fVar107 * fVar131 + fVar98 * fVar95 + fVar99 * fStack_11c +
                         fVar96 * fVar121 + fVar113 * fVar110 + fVar7 * fVar94 + 0.0;
                fVar107 = fVar102 * fVar128 + fVar122 * fVar127 + fVar105 * local_128;
                fVar113 = fVar102 * fVar129 + fVar122 * fVar136 + fVar105 * fStack_124;
              }
            }
            else {
              pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x24);
              auVar23._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar23._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar23._8_4_ = -(uint)(pfVar3[2] != 1.0);
              auVar23._12_4_ = -(uint)(pfVar3[3] != 0.0);
              uVar74 = movmskps(uVar74,auVar23);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                 (((uVar74 & 4) != 0 ||
                  (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_001607b5;
              pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x14);
              auVar24._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar24._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar24._8_4_ = -(uint)(pfVar3[2] != 0.0);
              auVar24._12_4_ = -(uint)(pfVar3[3] != 1.0);
              uVar74 = movmskps(uVar74,auVar24);
              if (((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
                 || (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_001607b5;
              pfVar3 = (float *)((long)pAVar64 + lVar73 + -4);
              auVar25._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar3[2] != 0.0);
              auVar25._12_4_ = -(uint)(pfVar3[3] != 0.0);
              uVar74 = movmskps(uVar74,auVar25);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
              goto LAB_001607b5;
              bVar67 = ((byte)uVar74 & 8) >> 3;
              uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
              uVar70 = (ulong)uVar74;
              if ((bVar67 != 0) ||
                 ((bVar11 != false &&
                  ((fVar78 = *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc),
                   fVar78 != 1.0 || (NAN(fVar78))))))) goto LAB_001607b5;
              fVar97 = *pfVar2;
              local_178 = pfVar2[1];
              fVar100 = pfVar2[2];
              fVar78 = pfVar2[3];
              fVar107 = pfVar2[4];
              fVar113 = pfVar2[5];
              fVar117 = pfVar2[6];
              fVar120 = pfVar2[7];
              fVar101 = pfVar2[8];
              fVar103 = pfVar2[9];
              fVar104 = pfVar2[10];
              fVar116 = pfVar2[0xb];
              fVar125 = pfVar2[0xc];
              fVar119 = pfVar2[0xd];
              fVar91 = pfVar2[0xe];
              fVar96 = pfVar2[0xf];
              local_158.quaternion = (bool)bVar60;
            }
LAB_0016123b:
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
            *pfVar2 = fVar97;
            pfVar2[1] = local_178;
            pfVar2[2] = fVar100;
            pfVar2[3] = fVar78;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
            *pfVar2 = fVar107;
            pfVar2[1] = fVar113;
            pfVar2[2] = fVar117;
            pfVar2[3] = fVar120;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
            *pfVar2 = fVar101;
            pfVar2[1] = fVar103;
            pfVar2[2] = fVar104;
            pfVar2[3] = fVar116;
            pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
            *pfVar2 = fVar125;
            pfVar2[1] = fVar119;
            pfVar2[2] = fVar91;
            pfVar2[3] = fVar96;
            uVar71 = uVar71 + 1;
            lVar73 = lVar73 + 0x40;
            plVar62 = local_110;
          } while (uVar71 < (spaces->spaces).size_active);
        }
      }
      else {
        if (sVar13 != plVar62[0xf]) {
          prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar65,"number of transformations does not match");
          __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar78 = (spaces->time_range).lower;
        fVar100 = (spaces->time_range).upper;
        fVar107 = (float)plVar62[0xd];
        fVar125 = (float)((ulong)plVar62[0xd] >> 0x20);
        uVar74 = -(uint)(fVar78 < fVar107);
        uVar76 = -(uint)(fVar100 < fVar125);
        local_158.time_range.upper = (float)(~uVar76 & (uint)fVar125 | (uint)fVar100 & uVar76);
        local_158.time_range.lower = (float)(~uVar74 & (uint)fVar78 | (uint)fVar107 & uVar74);
        local_158.spaces.size_active = 0;
        local_158.spaces.size_alloced = 0;
        local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar70 = extraout_RDX;
        if (sVar13 != 0) {
          local_158.spaces.items =
               (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
               alignedMalloc(sVar13 << 6,0x10);
          uVar70 = extraout_RDX_08;
          local_158.spaces.size_alloced = sVar13;
        }
        local_158.quaternion = true;
        if (spaces->quaternion == false) {
          local_158.quaternion = SUB41((int)plVar62[0x12],0);
        }
        local_158.spaces.size_active = local_158.spaces.size_alloced;
        if ((spaces->spaces).size_active != 0) {
          lVar73 = 0x30;
          uVar71 = 0;
          do {
            uVar74 = (uint)uVar70;
            pAVar64 = (spaces->spaces).items;
            lVar14 = plVar62[0x11];
            bVar11 = spaces->quaternion;
            bVar60 = *(byte *)(plVar62 + 0x12);
            local_158.quaternion = false;
            fVar78 = *(float *)((long)pAVar64 + lVar73 + -0x30);
            uVar8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x2c);
            fVar100 = (float)((ulong)uVar8 >> 0x20);
            local_178 = (float)uVar8;
            if (((((fVar78 != 1.0) || (NAN(fVar78))) || (local_178 != 0.0)) ||
                ((NAN(local_178) || (fVar100 != 0.0)))) || (NAN(fVar100))) {
LAB_00161456:
              uVar8 = *(undefined8 *)(lVar14 + -0x30 + lVar73);
              fVar107 = (float)uVar8;
              fVar125 = (float)((ulong)uVar8 >> 0x20);
              iVar75 = -(uint)(fVar107 != 1.0);
              iVar77 = -(uint)(fVar125 != 0.0);
              auVar84._4_4_ = iVar77;
              auVar84._0_4_ = iVar75;
              auVar84._8_4_ = iVar77;
              auVar84._12_4_ = iVar77;
              auVar83._8_8_ = auVar84._8_8_;
              auVar83._4_4_ = iVar75;
              auVar83._0_4_ = iVar75;
              uVar74 = movmskpd(uVar74,auVar83);
              uVar70 = (ulong)uVar74;
              fVar78 = *(float *)(lVar14 + -0x28 + lVar73);
              if ((uVar74 & 1) == 0) {
                bVar67 = (byte)uVar74 >> 1;
                uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                uVar70 = (ulong)uVar74;
                if (((bVar67 == 0) && (fVar78 == 0.0)) && (!NAN(fVar78))) {
                  pfVar2 = (float *)(lVar14 + -0x24 + lVar73);
                  auVar48._4_4_ = -(uint)(pfVar2[1] != 0.0);
                  auVar48._0_4_ = -(uint)(*pfVar2 != 0.0);
                  auVar48._8_4_ = -(uint)(pfVar2[2] != 1.0);
                  auVar48._12_4_ = -(uint)(pfVar2[3] != 0.0);
                  uVar74 = movmskps(uVar74,auVar48);
                  uVar70 = (ulong)uVar74;
                  if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) && ((uVar74 & 4) == 0)
                     ) {
                    bVar67 = ((byte)uVar74 & 8) >> 3;
                    uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                    uVar70 = (ulong)uVar74;
                    if (bVar67 == 0) {
                      pfVar2 = (float *)(lVar14 + -0x14 + lVar73);
                      auVar49._4_4_ = -(uint)(pfVar2[1] != 0.0);
                      auVar49._0_4_ = -(uint)(*pfVar2 != 0.0);
                      auVar49._8_4_ = -(uint)(pfVar2[2] != 0.0);
                      auVar49._12_4_ = -(uint)(pfVar2[3] != 1.0);
                      uVar74 = movmskps(uVar74,auVar49);
                      uVar70 = (ulong)uVar74;
                      if ((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                         ((uVar74 & 4) == 0)) {
                        bVar67 = ((byte)uVar74 & 8) >> 3;
                        uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
                        uVar70 = (ulong)uVar74;
                        if (bVar67 == 0) {
                          pfVar2 = (float *)(lVar14 + -4 + lVar73);
                          auVar50._4_4_ = -(uint)(pfVar2[1] != 0.0);
                          auVar50._0_4_ = -(uint)(*pfVar2 != 0.0);
                          auVar50._8_4_ = -(uint)(pfVar2[2] != 0.0);
                          auVar50._12_4_ = -(uint)(pfVar2[3] != 0.0);
                          uVar74 = movmskps(uVar74,auVar50);
                          uVar70 = (ulong)uVar74;
                          if ((((((bVar60 & (byte)uVar74) == 0) && ((uVar74 & 2) == 0)) &&
                               ((uVar74 & 4) == 0)) &&
                              (bVar67 = ((byte)uVar74 & 8) >> 3,
                              uVar70 = (ulong)CONCAT31((int3)(uVar74 >> 8),bVar67), bVar67 == 0)) &&
                             ((bVar60 == 0 ||
                              ((fVar120 = *(float *)(lVar14 + 0xc + lVar73), fVar120 == 1.0 &&
                               (!NAN(fVar120))))))) {
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x30);
                            fVar97 = *pfVar2;
                            local_178 = pfVar2[1];
                            fVar100 = pfVar2[2];
                            fVar78 = pfVar2[3];
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x20);
                            fVar107 = *pfVar2;
                            fVar113 = pfVar2[1];
                            fVar117 = pfVar2[2];
                            fVar120 = pfVar2[3];
                            pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x10);
                            fVar101 = *pfVar2;
                            fVar103 = pfVar2[1];
                            fVar104 = pfVar2[2];
                            fVar116 = pfVar2[3];
                            pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                            fVar125 = *pfVar2;
                            fVar119 = pfVar2[1];
                            fVar91 = pfVar2[2];
                            fVar96 = pfVar2[3];
                            local_158.quaternion = bVar11;
                            goto LAB_00161f1a;
                          }
                        }
                      }
                    }
                  }
                }
              }
              if ((bVar11 == false) && (bVar60 == 0)) {
                pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x30);
                fVar136 = *pfVar2;
                fVar92 = pfVar2[1];
                fVar93 = pfVar2[2];
                fVar94 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x20);
                fVar95 = *pfVar2;
                fVar98 = pfVar2[1];
                fVar99 = pfVar2[2];
                fVar134 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x10);
                fVar102 = *pfVar2;
                fVar135 = pfVar2[1];
                fVar137 = pfVar2[2];
                fVar122 = pfVar2[3];
                fVar97 = fVar107 * fVar136 + fVar125 * fVar95 + fVar78 * fVar102;
                local_178 = fVar107 * fVar92 + fVar125 * fVar98 + fVar78 * fVar135;
                fVar100 = fVar107 * fVar93 + fVar125 * fVar99 + fVar78 * fVar137;
                fVar113 = *(float *)(lVar14 + -0x20 + lVar73);
                fVar7 = *(float *)(lVar14 + -0x1c + lVar73);
                fVar126 = *(float *)(lVar14 + -0x18 + lVar73);
                fVar116 = *(float *)(lVar14 + -0x10 + lVar73);
                fVar117 = fVar113 * fVar93 + fVar7 * fVar99 + fVar126 * fVar137;
                fVar120 = fVar113 * fVar94 + fVar7 * fVar134 + fVar126 * fVar122;
                fVar119 = *(float *)(lVar14 + -0xc + lVar73);
                fVar91 = *(float *)(lVar14 + -8 + lVar73);
                fVar101 = fVar116 * fVar136 + fVar119 * fVar95 + fVar91 * fVar102;
                fVar103 = fVar116 * fVar92 + fVar119 * fVar98 + fVar91 * fVar135;
                fVar104 = fVar116 * fVar93 + fVar119 * fVar99 + fVar91 * fVar137;
                fVar96 = *(float *)(lVar14 + lVar73);
                fVar127 = *(float *)(lVar14 + 4 + lVar73);
                fVar133 = *(float *)(lVar14 + 8 + lVar73);
                pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                fVar116 = fVar116 * fVar94 + fVar119 * fVar134 + fVar91 * fVar122;
                fVar78 = fVar107 * fVar94 + fVar125 * fVar134 + fVar78 * fVar122;
                fVar125 = fVar96 * fVar136 + fVar127 * fVar95 + fVar133 * fVar102 + *pfVar2;
                fVar119 = fVar96 * fVar92 + fVar127 * fVar98 + fVar133 * fVar135 + pfVar2[1];
                fVar91 = fVar96 * fVar93 + fVar127 * fVar99 + fVar133 * fVar137 + pfVar2[2];
                fVar96 = fVar96 * fVar94 + fVar127 * fVar134 + fVar133 * fVar122 + pfVar2[3];
                fVar107 = fVar113 * fVar136 + fVar7 * fVar95 + fVar126 * fVar102;
                fVar113 = fVar113 * fVar92 + fVar7 * fVar98 + fVar126 * fVar135;
              }
              else if ((bVar11 == false) || (bVar60 == 0)) {
                if ((bVar11 == false) || (bVar60 != 0)) {
                  if (((local_178 != 0.0) ||
                      (((NAN(local_178) || (fVar100 != 0.0)) || (NAN(fVar100))))) ||
                     (uVar8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x10),
                     auVar29._4_4_ = -(uint)(*(float *)((long)pAVar64 + lVar73 + -0x20) != 0.0),
                     auVar29._0_4_ = -(uint)(*(float *)((long)pAVar64 + lVar73 + -0x18) != 0.0),
                     auVar29._8_4_ = -(uint)((float)uVar8 != 0.0),
                     auVar29._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                     uVar61 = movmskps((int)CONCAT71((int7)((ulong)plVar62 >> 8),bVar60),auVar29),
                     (char)uVar61 != '\0')) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_11;
                  }
                  pfVar3 = (float *)(lVar14 + -0x30 + lVar73);
                  fVar78 = pfVar3[3];
                  pfVar4 = (float *)(lVar14 + -0x20 + lVar73);
                  fVar107 = *pfVar4;
                  fVar120 = pfVar4[3];
                  pfVar6 = (float *)(lVar14 + -0x10 + lVar73);
                  fVar101 = *pfVar6;
                  fVar103 = pfVar6[1];
                  fVar116 = pfVar6[3];
                  pfVar2 = (float *)(lVar14 + lVar73);
                  fVar125 = *pfVar2;
                  fVar119 = pfVar2[1];
                  fVar91 = pfVar2[2];
                  fVar96 = pfVar2[3];
                  uVar8 = *(undefined8 *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                  fVar97 = *(float *)((long)pAVar64 + lVar73 + -0x30) * *pfVar3;
                  local_178 = pfVar3[1] + (float)uVar8;
                  fVar100 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                  fVar117 = pfVar4[2] + *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 8);
                  fVar113 = pfVar4[1] * *(float *)((long)pAVar64 + lVar73 + -0x1c);
                  fVar104 = pfVar6[2] * *(float *)((long)pAVar64 + lVar73 + -8);
                  local_158.quaternion = true;
                }
                else {
                  local_c8 = ZEXT416(*(uint *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc));
                  local_a8 = ZEXT416(*(uint *)((long)pAVar64 + lVar73 + -0x24));
                  local_d8 = ZEXT416(*(uint *)((long)pAVar64 + lVar73 + -4));
                  pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x20);
                  local_e8 = *pfVar2;
                  fStack_e4 = pfVar2[1];
                  fStack_dc = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x10);
                  local_f8 = *pfVar2;
                  fStack_f4 = pfVar2[1];
                  fStack_f0 = pfVar2[2];
                  fStack_ec = pfVar2[3];
                  local_b8 = *(undefined8 *)((long)pAVar64 + lVar73 + -0x18);
                  uStack_b0 = 0;
                  pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x30);
                  local_88 = *pfVar2;
                  fStack_7c = pfVar2[1];
                  pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
                  fVar78 = *pfVar2;
                  fVar107 = pfVar2[1];
                  fVar125 = pfVar2[2];
                  pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
                  fVar120 = *pfVar2;
                  fVar101 = pfVar2[1];
                  fVar103 = pfVar2[2];
                  puVar5 = (undefined8 *)(lVar14 + -0x10 + lVar73);
                  local_108 = *puVar5;
                  uStack_100 = puVar5[1];
                  pfVar2 = (float *)(lVar14 + lVar73);
                  fVar116 = *pfVar2;
                  fVar119 = pfVar2[1];
                  fVar91 = pfVar2[2];
                  fVar97 = fVar78 * local_88 + fVar107 * local_e8 + fVar125 * local_f8;
                  fVar96 = fVar78 * 0.0 + fVar107 * fStack_e4 + fVar125 * fStack_f4;
                  fVar78 = fVar78 * 0.0 + fVar107 * 0.0 + fVar125 * fStack_f0;
                  local_128 = fVar120 * local_88 + fVar101 * local_e8 + fVar103 * local_f8;
                  fStack_124 = fVar120 * 0.0 + fVar101 * fStack_e4 + fVar103 * fStack_f4;
                  fStack_120 = fVar120 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                  fStack_11c = fVar120 * fStack_7c + fVar101 * fStack_dc + fVar103 * fStack_ec;
                  fStack_e0 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                  local_98 = fVar116 * local_88 + fVar119 * local_e8 + fVar91 * local_f8 + *pfVar2;
                  fStack_94 = fVar116 * 0.0 + fVar119 * fStack_e4 + fVar91 * fStack_f4 + pfVar2[1];
                  fStack_90 = fVar116 * 0.0 + fVar119 * 0.0 + fVar91 * fStack_f0 + pfVar2[2];
                  fStack_8c = fVar116 * fStack_7c + fVar119 * fStack_dc + fVar91 * fStack_ec +
                              pfVar2[3];
                  if ((((fVar96 != 0.0) || (NAN(fVar96))) ||
                      ((fVar78 != 0.0 || ((NAN(fVar78) || (fStack_120 != 0.0)))))) ||
                     (NAN(fStack_120))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_10;
                  }
                  fVar101 = local_88 * (float)local_108 +
                            local_e8 * local_108._4_4_ + local_f8 * (float)uStack_100;
                  fVar103 = fStack_84 * (float)local_108 +
                            fStack_e4 * local_108._4_4_ + fStack_f4 * (float)uStack_100;
                  fVar104 = fStack_80 * (float)local_108 +
                            fStack_e0 * local_108._4_4_ + fStack_f0 * (float)uStack_100;
                  local_158.quaternion = true;
                  fVar117 = (float)local_b8;
                  fVar120 = (float)((ulong)local_b8 >> 0x20);
                  fVar116 = (float)local_d8._0_4_;
                  fVar78 = (float)local_a8._0_4_;
                  fVar125 = local_98;
                  fVar119 = fStack_94;
                  fVar91 = fStack_90;
                  fVar96 = (float)local_c8._0_4_;
                  fVar107 = local_128;
                  fVar113 = fStack_124;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                std::ostream::put(-0x38);
                std::ostream::flush();
                fVar78 = *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc);
                fVar100 = *(float *)((long)pAVar64 + lVar73 + -0x24);
                fVar107 = *(float *)((long)pAVar64 + lVar73 + -0x14);
                fVar125 = *(float *)((long)pAVar64 + lVar73 + -4);
                auVar10 = *(undefined1 (*) [16])((long)pAVar64 + lVar73 + -0x30);
                pfVar3 = (float *)((long)pAVar64 + lVar73 + -0x20);
                fVar120 = *pfVar3;
                fVar101 = pfVar3[1];
                pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x10);
                fVar103 = *pfVar2;
                fVar116 = pfVar2[1];
                fVar119 = pfVar2[2];
                fVar127 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar104 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar126 = fVar107 * fVar107 + fVar104 + -fVar125 * fVar125;
                fVar136 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar91 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar133 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar78 = fVar107 * fVar125 - fVar78 * fVar100;
                pfVar2 = (float *)((long)&(pAVar64->l).vx.field_0 + lVar73);
                fVar96 = *pfVar2;
                fVar113 = pfVar2[1];
                fVar7 = pfVar2[2];
                fVar127 = fVar127 + fVar127;
                fVar136 = fVar136 + fVar136;
                fVar97 = fVar97 + fVar97;
                fVar133 = fVar133 + fVar133;
                fVar91 = fVar91 + fVar91;
                fVar78 = fVar78 + fVar78;
                fVar100 = fVar125 * fVar125 + fVar104 + -fVar107 * fVar107;
                fVar111 = fVar117 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar114 = fVar117 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                fVar118 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                fVar121 = fVar117 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar106 = fVar97 * 1.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar108 = fVar97 * 0.0 + fVar126 * 1.0 + fVar133 * 0.0;
                fVar109 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 1.0;
                fVar110 = fVar97 * 0.0 + fVar126 * 0.0 + fVar133 * 0.0;
                fVar126 = fVar91 * 1.0 + fVar78 * 0.0 + fVar100 * 0.0;
                fVar133 = fVar91 * 0.0 + fVar78 * 1.0 + fVar100 * 0.0;
                fVar92 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 1.0;
                fVar94 = fVar91 * 0.0 + fVar78 * 0.0 + fVar100 * 0.0;
                local_168 = auVar10._4_4_;
                fStack_164 = auVar10._8_4_;
                local_178 = auVar10._0_4_;
                fVar128 = local_178 * fVar111 + fVar106 * 0.0 + fVar126 * 0.0;
                fVar129 = local_178 * fVar114 + fVar108 * 0.0 + fVar133 * 0.0;
                fVar130 = local_178 * fVar118 + fVar109 * 0.0 + fVar92 * 0.0;
                fVar131 = local_178 * fVar121 + fVar110 * 0.0 + fVar94 * 0.0;
                fVar127 = fVar120 * fVar111 + fVar101 * fVar106 + fVar126 * 0.0;
                fVar136 = fVar120 * fVar114 + fVar101 * fVar108 + fVar133 * 0.0;
                fVar93 = fVar120 * fVar118 + fVar101 * fVar109 + fVar92 * 0.0;
                fVar95 = fVar120 * fVar121 + fVar101 * fVar110 + fVar94 * 0.0;
                local_128 = fVar103 * fVar111 + fVar116 * fVar106 + fVar119 * fVar126;
                fStack_124 = fVar103 * fVar114 + fVar116 * fVar108 + fVar119 * fVar133;
                fStack_120 = fVar103 * fVar118 + fVar116 * fVar109 + fVar119 * fVar92;
                fStack_11c = fVar103 * fVar121 + fVar116 * fVar110 + fVar119 * fVar94;
                fVar78 = *(float *)(lVar14 + 0xc + lVar73);
                fVar100 = *(float *)(lVar14 + -0x24 + lVar73);
                fVar107 = *(float *)(lVar14 + -0x14 + lVar73);
                fVar125 = *(float *)(lVar14 + -4 + lVar73);
                fVar104 = fVar100 * fVar107 + fVar78 * fVar125;
                fVar97 = fVar100 * fVar107 - fVar78 * fVar125;
                fVar117 = fVar78 * fVar78 + fVar100 * fVar100 + -fVar107 * fVar107 +
                          -fVar125 * fVar125;
                fVar101 = fVar78 * fVar78 - fVar100 * fVar100;
                fVar135 = fVar107 * fVar107 + fVar101 + -fVar125 * fVar125;
                fVar134 = fVar100 * fVar125 - fVar78 * fVar107;
                fVar102 = fVar78 * fVar107 + fVar100 * fVar125;
                fVar137 = fVar107 * fVar125 + fVar78 * fVar100;
                fVar91 = fVar107 * fVar125 - fVar78 * fVar100;
                pfVar4 = (float *)(lVar14 + -0x30 + lVar73);
                fVar78 = *pfVar4;
                pfVar6 = (float *)(lVar14 + -0x20 + lVar73);
                fVar100 = *pfVar6;
                fVar120 = pfVar6[1];
                fVar122 = fVar125 * fVar125 + fVar101 + -fVar107 * fVar107;
                pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
                fVar107 = *pfVar2;
                fVar125 = pfVar2[1];
                fVar101 = pfVar2[2];
                fVar104 = fVar104 + fVar104;
                fVar134 = fVar134 + fVar134;
                pfVar2 = (float *)(lVar14 + lVar73);
                fVar103 = *pfVar2;
                fVar116 = pfVar2[1];
                fVar119 = pfVar2[2];
                fVar98 = fVar117 * 1.0 + fVar104 * 0.0 + fVar134 * 0.0;
                fVar99 = fVar117 * 0.0 + fVar104 * 1.0 + fVar134 * 0.0;
                fVar134 = fVar117 * 0.0 + fVar104 * 0.0 + fVar134 * 1.0;
                fVar97 = fVar97 + fVar97;
                fVar137 = fVar137 + fVar137;
                fVar102 = fVar102 + fVar102;
                fVar91 = fVar91 + fVar91;
                fVar117 = fVar97 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                fVar104 = fVar97 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                fVar97 = fVar97 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                fVar135 = fVar102 * 1.0 + fVar91 * 0.0 + fVar122 * 0.0;
                fVar137 = fVar102 * 0.0 + fVar91 * 1.0 + fVar122 * 0.0;
                fVar91 = fVar102 * 0.0 + fVar91 * 0.0 + fVar122 * 1.0;
                fVar112 = fVar78 * fVar98 + fVar117 * 0.0 + fVar135 * 0.0;
                fVar115 = fVar78 * fVar99 + fVar104 * 0.0 + fVar137 * 0.0;
                fVar78 = fVar78 * fVar134 + fVar97 * 0.0 + fVar91 * 0.0;
                fVar102 = fVar100 * fVar98 + fVar120 * fVar117 + fVar135 * 0.0;
                fVar122 = fVar100 * fVar99 + fVar120 * fVar104 + fVar137 * 0.0;
                fVar105 = fVar100 * fVar134 + fVar120 * fVar97 + fVar91 * 0.0;
                fVar123 = fVar107 * fVar98 + fVar125 * fVar117 + fVar101 * fVar135;
                fVar124 = fVar107 * fVar99 + fVar125 * fVar104 + fVar101 * fVar137;
                fVar125 = fVar107 * fVar134 + fVar125 * fVar97 + fVar101 * fVar91;
                fVar107 = fVar103 * fVar98 + fVar116 * fVar117 + fVar119 * fVar135 + pfVar4[1] + 0.0
                ;
                fVar98 = fVar103 * fVar99 + fVar116 * fVar104 + fVar119 * fVar137 + pfVar4[2] + 0.0;
                fVar99 = fVar103 * fVar134 + fVar116 * fVar97 + fVar119 * fVar91 + pfVar6[2] + 0.0;
                fVar97 = fVar112 * fVar128 + fVar115 * fVar127 + fVar78 * local_128;
                local_178 = fVar112 * fVar129 + fVar115 * fVar136 + fVar78 * fStack_124;
                fVar100 = fVar112 * fVar130 + fVar115 * fVar93 + fVar78 * fStack_120;
                fVar117 = fVar102 * fVar130 + fVar122 * fVar93 + fVar105 * fStack_120;
                fVar120 = fVar102 * fVar131 + fVar122 * fVar95 + fVar105 * fStack_11c;
                fVar101 = fVar123 * fVar128 + fVar124 * fVar127 + fVar125 * local_128;
                fVar103 = fVar123 * fVar129 + fVar124 * fVar136 + fVar125 * fStack_124;
                fVar104 = fVar123 * fVar130 + fVar124 * fVar93 + fVar125 * fStack_120;
                uVar70 = extraout_RDX_09;
                fVar116 = fVar123 * fVar131 + fVar124 * fVar95 + fVar125 * fStack_11c;
                fVar78 = fVar112 * fVar131 + fVar115 * fVar95 + fVar78 * fStack_11c;
                fVar125 = fVar107 * fVar128 + fVar98 * fVar127 + fVar99 * local_128 +
                          fVar96 * fVar111 + fVar113 * fVar106 + fVar7 * fVar126 + local_168 + 0.0;
                fVar119 = fVar107 * fVar129 + fVar98 * fVar136 + fVar99 * fStack_124 +
                          fVar96 * fVar114 + fVar113 * fVar108 + fVar7 * fVar133 + fStack_164 + 0.0;
                fVar91 = fVar107 * fVar130 + fVar98 * fVar93 + fVar99 * fStack_120 +
                         fVar96 * fVar118 + fVar113 * fVar109 + fVar7 * fVar92 + pfVar3[2] + 0.0;
                fVar96 = fVar107 * fVar131 + fVar98 * fVar95 + fVar99 * fStack_11c +
                         fVar96 * fVar121 + fVar113 * fVar110 + fVar7 * fVar94 + 0.0;
                fVar107 = fVar102 * fVar128 + fVar122 * fVar127 + fVar105 * local_128;
                fVar113 = fVar102 * fVar129 + fVar122 * fVar136 + fVar105 * fStack_124;
              }
            }
            else {
              pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x24);
              auVar10._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar10._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar10._8_4_ = -(uint)(pfVar2[2] != 1.0);
              auVar10._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar74 = movmskps(uVar74,auVar10);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) ||
                 (((uVar74 & 4) != 0 ||
                  (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_00161456;
              pfVar2 = (float *)((long)pAVar64 + lVar73 + -0x14);
              auVar27._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar27._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar27._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar27._12_4_ = -(uint)(pfVar2[3] != 1.0);
              uVar74 = movmskps(uVar74,auVar27);
              if (((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
                 || (bVar67 = ((byte)uVar74 & 8) >> 3, uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_00161456;
              pfVar2 = (float *)((long)pAVar64 + lVar73 + -4);
              auVar28._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar28._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar28._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar28._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar74 = movmskps(uVar74,auVar28);
              if ((((bVar11 & (byte)uVar74) != 0) || ((uVar74 & 2) != 0)) || ((uVar74 & 4) != 0))
              goto LAB_00161456;
              bVar67 = ((byte)uVar74 & 8) >> 3;
              uVar74 = CONCAT31((int3)(uVar74 >> 8),bVar67);
              uVar70 = (ulong)uVar74;
              if ((bVar67 != 0) ||
                 ((bVar11 != false &&
                  ((fVar78 = *(float *)((long)&(pAVar64->l).vx.field_0 + lVar73 + 0xc),
                   fVar78 != 1.0 || (NAN(fVar78))))))) goto LAB_00161456;
              pfVar2 = (float *)(lVar14 + -0x30 + lVar73);
              fVar97 = *pfVar2;
              local_178 = pfVar2[1];
              fVar100 = pfVar2[2];
              fVar78 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + -0x20 + lVar73);
              fVar107 = *pfVar2;
              fVar113 = pfVar2[1];
              fVar117 = pfVar2[2];
              fVar120 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + -0x10 + lVar73);
              fVar101 = *pfVar2;
              fVar103 = pfVar2[1];
              fVar104 = pfVar2[2];
              fVar116 = pfVar2[3];
              pfVar2 = (float *)(lVar14 + lVar73);
              fVar125 = *pfVar2;
              fVar119 = pfVar2[1];
              fVar91 = pfVar2[2];
              fVar96 = pfVar2[3];
              local_158.quaternion = (bool)bVar60;
            }
LAB_00161f1a:
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x30);
            *pfVar2 = fVar97;
            pfVar2[1] = local_178;
            pfVar2[2] = fVar100;
            pfVar2[3] = fVar78;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x20);
            *pfVar2 = fVar107;
            pfVar2[1] = fVar113;
            pfVar2[2] = fVar117;
            pfVar2[3] = fVar120;
            pfVar2 = (float *)((long)local_158.spaces.items + lVar73 + -0x10);
            *pfVar2 = fVar101;
            pfVar2[1] = fVar103;
            pfVar2[2] = fVar104;
            pfVar2[3] = fVar116;
            pfVar2 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar73);
            *pfVar2 = fVar125;
            pfVar2[1] = fVar119;
            pfVar2[2] = fVar91;
            pfVar2[3] = fVar96;
            uVar71 = uVar71 + 1;
            lVar73 = lVar73 + 0x40;
            plVar62 = local_110;
          } while (uVar71 < (spaces->spaces).size_active);
        }
      }
      convertInstances(local_70,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)local_78,(Ref<embree::SceneGraph::Node> *)(plVar62 + 0x13),
                       &local_158);
      alignedFree(local_158.spaces.items);
    }
    if (plVar62 != (long *)0x0) {
      (**(code **)(*plVar62 + 0x18))(plVar62);
    }
  }
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::TransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }